

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::ConvolutionDepthWise_x86_fma::forward_int8_x86
          (ConvolutionDepthWise_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  int *piVar3;
  void *pvVar4;
  Layer *pLVar5;
  float fVar6;
  uint _elempack;
  int iVar7;
  size_t sVar8;
  undefined8 uVar9;
  undefined1 auVar10 [32];
  undefined8 uVar11;
  undefined1 uVar12;
  _func_int *p_Var13;
  undefined4 *puVar14;
  long lVar15;
  ulong uVar16;
  void *pvVar17;
  _func_int **pp_Var18;
  int g_2;
  uint uVar19;
  uint uVar20;
  undefined1 *puVar21;
  void *pvVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  ulong uVar27;
  int iVar28;
  ulong uVar29;
  _Vector_base<float,_std::allocator<float>_> *p_Var30;
  long lVar31;
  undefined1 (*pauVar32) [16];
  undefined1 (*pauVar33) [16];
  long lVar34;
  float *pfVar35;
  long lVar36;
  int remain_1;
  int iVar37;
  long lVar38;
  int iVar39;
  int k;
  ulong uVar40;
  _func_int **pp_Var41;
  int iVar42;
  uint uVar43;
  void *pvVar44;
  int g;
  ulong uVar45;
  void *pvVar46;
  ulong uVar47;
  long lVar48;
  void *pvVar49;
  bool bVar50;
  float fVar51;
  float fVar52;
  undefined1 auVar53 [16];
  undefined4 uVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [12];
  undefined1 in_ZMM2 [64];
  float fVar97;
  __m128 pos_1;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [64];
  __m128 pos;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [64];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  __m128 _b;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 in_ZMM7 [64];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  __m128 max;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  ulong local_338;
  float *local_330;
  byte local_310;
  byte local_300;
  long local_2f8;
  Mat local_2d8;
  _func_int **local_288;
  size_type local_280;
  ulong local_278;
  void *local_270;
  float top_rescale;
  int iStack_264;
  Allocator *pAStack_260;
  Allocator *pAStack_258;
  int iStack_250;
  undefined4 uStack_24c;
  Allocator *local_248;
  int iStack_240;
  int iStack_23c;
  int iStack_238;
  int iStack_234;
  int iStack_230;
  undefined4 uStack_22c;
  size_t local_228;
  Option opt_q;
  float scale_out;
  undefined4 uStack_1ac;
  int *local_1a8;
  Allocator *local_1a0;
  int local_198;
  long *local_190;
  bool local_188;
  bool bStack_187;
  bool bStack_186;
  bool bStack_185;
  bool bStack_184;
  bool bStack_183;
  bool bStack_182;
  bool bStack_181;
  int iStack_180;
  bool bStack_17c;
  bool bStack_17b;
  bool bStack_17a;
  bool bStack_179;
  int local_178;
  ulong local_170;
  Mat local_168;
  Mat m_1;
  _Vector_base<float,_std::allocator<float>_> local_d8;
  _Vector_base<float,_std::allocator<float>_> local_c0;
  _Vector_base<float,_std::allocator<float>_> local_a8;
  _Vector_base<float,_std::allocator<float>_> local_90;
  Option opt_g;
  
  _b = in_ZMM7._0_16_;
  auVar112 = in_ZMM2._0_16_;
  local_168.c = bottom_blob->c;
  local_168.elempack = bottom_blob->elempack;
  local_168.elemsize = bottom_blob->elemsize;
  pp_Var41 = this->_vptr_ConvolutionDepthWise_x86_fma;
  p_Var13 = pp_Var41[-3];
  iVar42 = *(int *)(&this->field_0xd4 + (long)p_Var13);
  iVar24 = *(int *)(&this->field_0xd8 + (long)p_Var13);
  iVar23 = *(int *)(&this->field_0xdc + (long)p_Var13);
  iVar37 = *(int *)(&this->field_0xe0 + (long)p_Var13);
  piVar3 = bottom_blob->refcount;
  local_168.data = bottom_blob->data;
  local_168.refcount = bottom_blob->refcount;
  local_168.allocator = bottom_blob->allocator;
  local_168.dims = bottom_blob->dims;
  local_168.w = bottom_blob->w;
  local_168.h = bottom_blob->h;
  local_168.d = bottom_blob->d;
  local_168.cstep = bottom_blob->cstep;
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + 1;
    UNLOCK();
    pp_Var41 = this->_vptr_ConvolutionDepthWise_x86_fma;
  }
  if (local_168.elempack == 0 || ((int)local_168.elemsize * 8) / local_168.elempack != 8) {
    iVar25 = local_168.elempack * local_168.c;
    iVar39 = *(int *)(&this->field_0x108 + (long)pp_Var41[-3]);
    local_2d8.cstep = 0;
    local_2d8.data = (undefined4 *)0x0;
    local_2d8.refcount._0_4_ = 0;
    local_2d8.refcount._4_4_ = 0;
    local_2d8.elemsize = 0;
    local_2d8.elempack = 0;
    local_2d8.allocator = (Allocator *)0x0;
    local_2d8.dims = 0;
    local_2d8.w = 0;
    local_2d8.h = 0;
    local_2d8.d = 0;
    local_2d8.c = 0;
    lVar31 = 0;
    Mat::create(&local_2d8,iVar25,4,(Allocator *)0x0);
    iVar25 = iVar25 / iVar39;
    pp_Var41 = this->_vptr_ConvolutionDepthWise_x86_fma;
    puVar14 = (undefined4 *)local_2d8.data;
    if (iVar25 < 1) {
      iVar25 = 0;
    }
    for (; lVar31 < *(int *)(&this->field_0x108 + (long)pp_Var41[-3]); lVar31 = lVar31 + 1) {
      uVar54 = *(undefined4 *)(*(long *)(&this->field_0x240 + (long)pp_Var41[-3]) + lVar31 * 4);
      iVar39 = iVar25;
      while (bVar50 = iVar39 != 0, iVar39 = iVar39 + -1, bVar50) {
        *puVar14 = uVar54;
        puVar14 = puVar14 + 1;
      }
    }
    opt_q.lightmode = opt->lightmode;
    opt_q._1_3_ = *(undefined3 *)&opt->field_0x1;
    opt_q.num_threads = opt->num_threads;
    opt_q.workspace_allocator = opt->workspace_allocator;
    opt_q.openmp_blocktime = opt->openmp_blocktime;
    opt_q.use_winograd_convolution = opt->use_winograd_convolution;
    opt_q.use_sgemm_convolution = opt->use_sgemm_convolution;
    opt_q.use_int8_inference = opt->use_int8_inference;
    opt_q.use_vulkan_compute = opt->use_vulkan_compute;
    opt_q.use_bf16_storage = opt->use_bf16_storage;
    opt_q.use_fp16_packed = opt->use_fp16_packed;
    opt_q.use_fp16_storage = opt->use_fp16_storage;
    opt_q.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    opt_q.use_int8_packed = opt->use_int8_packed;
    opt_q.use_int8_storage = opt->use_int8_storage;
    opt_q.use_int8_arithmetic = opt->use_int8_arithmetic;
    opt_q.use_packing_layout = opt->use_packing_layout;
    opt_q.use_shader_pack8 = opt->use_shader_pack8;
    opt_q.use_subgroup_basic = opt->use_subgroup_basic;
    opt_q.use_subgroup_vote = opt->use_subgroup_vote;
    opt_q.use_subgroup_ballot = opt->use_subgroup_ballot;
    opt_q.use_subgroup_shuffle = opt->use_subgroup_shuffle;
    opt_q.use_image_storage = opt->use_image_storage;
    opt_q.use_tensor_storage = opt->use_tensor_storage;
    opt_q.use_reserved_0 = opt->use_reserved_0;
    opt_q.flush_denormals = opt->flush_denormals;
    opt_q.use_local_pool_allocator = opt->use_local_pool_allocator;
    opt_q.use_shader_local_memory = opt->use_shader_local_memory;
    opt_q.use_cooperative_matrix = opt->use_cooperative_matrix;
    opt_q.use_winograd23_convolution = opt->use_winograd23_convolution;
    opt_q.use_winograd43_convolution = opt->use_winograd43_convolution;
    opt_q.use_winograd63_convolution = opt->use_winograd63_convolution;
    opt_q.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
    opt_q.use_reserved_7 = opt->use_reserved_7;
    opt_q.use_reserved_8 = opt->use_reserved_8;
    opt_q.use_reserved_9 = opt->use_reserved_9;
    opt_q.use_reserved_10 = opt->use_reserved_10;
    opt_q.use_reserved_11 = opt->use_reserved_11;
    opt_q.blob_allocator = opt->workspace_allocator;
    in_ZMM2 = ZEXT1664(auVar112);
    in_ZMM7 = ZEXT1664((undefined1  [16])_b);
    quantize_to_int8(bottom_blob,&local_168,&local_2d8,&opt_q);
    piVar3 = (int *)CONCAT44(local_2d8.refcount._4_4_,local_2d8.refcount._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (local_2d8.allocator == (Allocator *)0x0) {
          free(local_2d8.data);
        }
        else {
          (*(local_2d8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    pp_Var41 = this->_vptr_ConvolutionDepthWise_x86_fma;
  }
  local_2d8.cstep = 0;
  local_2d8.data = (void *)0x0;
  local_2d8.refcount._0_4_ = 0;
  local_2d8.refcount._4_4_ = 0;
  local_2d8.elemsize = 0;
  local_2d8.elempack = 0;
  local_2d8.allocator = (Allocator *)0x0;
  local_2d8.dims = 0;
  local_2d8.w = 0;
  local_2d8.h = 0;
  local_2d8.d = 0;
  local_2d8.c = 0;
  ConvolutionDepthWise::make_padding
            ((ConvolutionDepthWise *)
             ((long)&this->_vptr_ConvolutionDepthWise_x86_fma + (long)pp_Var41[-3]),&local_168,
             &local_2d8,opt);
  iVar26 = local_2d8.c;
  iVar7 = local_2d8.w;
  iVar25 = local_2d8.elempack;
  iVar39 = -100;
  if ((local_2d8.data == (void *)0x0) || (local_2d8.cstep * (long)local_2d8.c == 0))
  goto LAB_0039ea1e;
  p_Var13 = this->_vptr_ConvolutionDepthWise_x86_fma[-3];
  iVar23 = (~((iVar42 + -1) * iVar23) + local_2d8.w) / *(int *)(&this->field_0xe4 + (long)p_Var13);
  iVar42 = (~((iVar24 + -1) * iVar37) + local_2d8.h) / *(int *)(&this->field_0xe8 + (long)p_Var13);
  iVar24 = iVar23 + 1;
  iVar37 = iVar42 + 1;
  uVar19 = local_2d8.elempack * local_2d8.c;
  uVar43 = 8;
  if ((uVar19 == *(uint *)(&this->field_0x108 + (long)p_Var13)) &&
     (uVar19 == *(uint *)(&this->field_0xd0 + (long)p_Var13))) {
    if (opt->use_packing_layout == false) {
      uVar43 = 1;
    }
    if ((uVar19 & 7) != 0) {
      uVar43 = 1;
    }
    iVar2 = *(int *)(&this->field_0x10c + (long)p_Var13);
    uVar20 = uVar43 * 4;
    if (100 < iVar2) {
      uVar20 = uVar43;
    }
    Mat::create(top_blob,iVar24,iVar37,(int)uVar19 / (int)uVar43,(ulong)uVar20,uVar43,
                opt->blob_allocator);
    if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
    goto LAB_0039ea1e;
    iVar39 = 0;
    if (iVar25 == 1) {
      pp_Var41 = this->_vptr_ConvolutionDepthWise_x86_fma;
      p_Var13 = pp_Var41[-3];
      iVar24 = *(int *)(&this->field_0xd8 + (long)p_Var13);
      if (iVar24 == 3 && *(int *)(&this->field_0xd4 + (long)p_Var13) == 3) {
        if ((((*(int *)(&this->field_0xe4 + (long)p_Var13) == 1) &&
             (*(int *)(&this->field_0xe8 + (long)p_Var13) == 1)) &&
            (*(int *)(&this->field_0xdc + (long)p_Var13) == 1)) &&
           ((*(int *)(&this->field_0xe0 + (long)p_Var13) == 1 &&
            (*(uint *)(&this->field_0x110 + (long)p_Var13) < 2)))) {
          if (iVar2 < 0x65) {
            opt_q.workspace_allocator = (Allocator *)0x0;
            opt_q.lightmode = false;
            opt_q._1_3_ = 0;
            opt_q.num_threads = 0;
            opt_q.blob_allocator = (Allocator *)0x0;
            lVar31 = 0;
            while( true ) {
              auVar96 = in_ZMM2._4_12_;
              p_Var13 = pp_Var41[-3];
              if (*(int *)(&this->field_0x108 + (long)p_Var13) <= lVar31) break;
              _top_rescale = (void *)CONCAT44(iStack_264,
                                              1.0 / (*(float *)(*(long *)(&this->field_0x1f8 +
                                                                         (long)p_Var13) + lVar31 * 4
                                                               ) *
                                                    *(float *)(*(long *)(&this->field_0x240 +
                                                                        (long)p_Var13) + lVar31 * 4)
                                                    ));
              std::vector<float,_std::allocator<float>_>::push_back
                        ((vector<float,_std::allocator<float>_> *)&opt_q,&top_rescale);
              lVar31 = lVar31 + 1;
              pp_Var41 = this->_vptr_ConvolutionDepthWise_x86_fma;
            }
            std::vector<float,_std::allocator<float>_>::vector
                      ((vector<float,_std::allocator<float>_> *)&local_a8,
                       (vector<float,_std::allocator<float>_> *)&opt_q);
            iVar42 = top_blob->w;
            iVar24 = top_blob->h;
            pvVar4 = (this->weight_data_tm).data;
            lVar31 = *(long *)(&this->field_0x1b0 + (long)p_Var13);
            iVar23 = top_blob->d;
            local_270 = top_blob->data;
            local_278 = top_blob->elemsize;
            lVar48 = top_blob->cstep * local_278;
            lVar34 = (long)iVar24 * (long)iVar42;
            local_280 = local_278 * lVar34 + 0xf & 0xfffffffffffffff0;
            local_288 = (_func_int **)(local_2d8.elemsize * local_2d8.cstep);
            iVar37 = 0;
            if (0 < iVar24) {
              iVar37 = iVar24;
            }
            iVar24 = top_blob->dims;
            uVar43 = top_blob->c;
            if (top_blob->c < 1) {
              uVar43 = 0;
            }
            pvVar22 = local_270;
            for (uVar47 = 0; uVar47 != uVar43; uVar47 = uVar47 + 1) {
              iVar39 = (int)(local_280 / local_278);
              if (iVar24 == 4) {
                iVar39 = (int)lVar34;
              }
              if (lVar31 == 0) {
                uVar54 = 0;
              }
              else {
                uVar54 = *(undefined4 *)(lVar31 + uVar47 * 4);
              }
              fVar52 = local_a8._M_impl.super__Vector_impl_data._M_start[uVar47];
              iVar39 = iVar39 * iVar23;
              if (iVar39 < 1) {
                iVar39 = 0;
              }
              for (lVar38 = 0; iVar39 != (int)lVar38; lVar38 = lVar38 + 1) {
                *(undefined4 *)((long)pvVar22 + lVar38 * 4) = uVar54;
              }
              lVar36 = uVar47 * 9;
              pvVar44 = (void *)((long)local_288 * uVar47 + (long)local_2d8.data);
              lVar38 = (long)local_2d8.w + (long)pvVar44;
              pvVar46 = (void *)((long)local_2d8.w * 2 + (long)pvVar44);
              pvVar49 = (void *)(lVar48 * uVar47 + (long)local_270);
              for (iVar39 = 0; iVar39 != iVar37; iVar39 = iVar39 + 1) {
                lVar15 = 0;
                pvVar17 = pvVar49;
                for (iVar25 = iVar42; 0 < iVar25; iVar25 = iVar25 + -1) {
                  auVar64._0_4_ =
                       (float)((int)*(char *)((long)pvVar4 + lVar36 + 8) *
                               (int)*(char *)((long)pvVar46 + lVar15 + 2) +
                               (int)*(char *)((long)pvVar4 + lVar36 + 7) *
                               (int)*(char *)((long)pvVar46 + lVar15 + 1) +
                              (int)*(char *)((long)pvVar4 + lVar36 + 6) *
                              (int)*(char *)((long)pvVar46 + lVar15) +
                              (int)*(char *)((long)pvVar4 + lVar36 + 5) *
                              (int)*(char *)(lVar38 + 2 + lVar15) +
                              (int)*(char *)((long)pvVar4 + lVar36 + 4) *
                              (int)*(char *)(lVar38 + 1 + lVar15) +
                              (int)*(char *)((long)pvVar4 + lVar36 + 3) *
                              (int)*(char *)(lVar38 + lVar15) +
                              (int)*(char *)((long)pvVar4 + lVar36 + 2) *
                              (int)*(char *)((long)pvVar44 + lVar15 + 2) +
                              (int)*(char *)((long)pvVar4 + lVar36 + 1) *
                              (int)*(char *)((long)pvVar44 + lVar15 + 1) +
                              (int)*(char *)((long)pvVar4 + lVar36) *
                              (int)*(char *)((long)pvVar44 + lVar15));
                  auVar64._4_12_ = auVar96;
                  auVar112 = vfmadd213ss_fma(auVar64,ZEXT416((uint)fVar52),
                                             ZEXT416(*(uint *)((long)pvVar49 + lVar15 * 4)));
                  *(int *)((long)pvVar49 + lVar15 * 4) = auVar112._0_4_;
                  pvVar17 = (void *)((long)pvVar17 + 4);
                  lVar15 = lVar15 + 1;
                }
                pvVar44 = (void *)((long)pvVar44 + lVar15 + 2);
                lVar38 = lVar38 + lVar15 + 2;
                pvVar46 = (void *)((long)pvVar46 + lVar15 + 2);
                pvVar49 = pvVar17;
              }
              pvVar22 = (void *)((long)pvVar22 + lVar48);
            }
            p_Var30 = &local_a8;
LAB_0039f350:
            std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(p_Var30);
            std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                      ((_Vector_base<float,_std::allocator<float>_> *)&opt_q);
          }
          else {
            opt_q.lightmode = false;
            opt_q._1_3_ = 0;
            opt_q.num_threads = 0;
            opt_q.blob_allocator = (Allocator *)0x0;
            opt_q.workspace_allocator = (Allocator *)0x0;
            lVar31 = 0;
            while( true ) {
              auVar96 = in_ZMM7._4_12_;
              p_Var13 = pp_Var41[-3];
              if (*(int *)(&this->field_0x108 + (long)p_Var13) <= lVar31) break;
              fVar52 = *(float *)(*(long *)(&this->field_0x1f8 + (long)p_Var13) + lVar31 * 4);
              fVar51 = 0.0;
              if (fVar52 != 0.0) {
                fVar51 = 1.0 / (fVar52 * *(float *)(*(long *)(&this->field_0x240 + (long)p_Var13) +
                                                   lVar31 * 4));
              }
              _top_rescale = (void *)CONCAT44(iStack_264,fVar51);
              _scale_out = (void *)CONCAT44(uStack_1ac,
                                            *(undefined4 *)
                                             (*(long *)(&this->field_0x288 + (long)p_Var13) +
                                             lVar31 * 4));
              std::vector<float,_std::allocator<float>_>::push_back
                        ((vector<float,_std::allocator<float>_> *)&opt_q,&top_rescale);
              std::vector<float,_std::allocator<float>_>::push_back
                        ((vector<float,_std::allocator<float>_> *)&opt_q,&scale_out);
              lVar31 = lVar31 + 1;
              pp_Var41 = this->_vptr_ConvolutionDepthWise_x86_fma;
            }
            std::vector<float,_std::allocator<float>_>::vector
                      ((vector<float,_std::allocator<float>_> *)&local_90,
                       (vector<float,_std::allocator<float>_> *)&opt_q);
            iVar42 = top_blob->w;
            iVar24 = top_blob->h;
            pvVar4 = (this->weight_data_tm).data;
            lVar31 = *(long *)(&this->field_0x1b0 + (long)p_Var13);
            uVar47 = 0;
            if (iVar24 < 1) {
              iVar24 = 0;
            }
            uVar16 = (ulong)(uint)top_blob->c;
            if (top_blob->c < 1) {
              uVar16 = uVar47;
            }
            auVar53._8_4_ = 0x80000000;
            auVar53._0_8_ = 0x8000000080000000;
            auVar53._12_4_ = 0x80000000;
            auVar65._8_4_ = 0x3effffff;
            auVar65._0_8_ = 0x3effffff3effffff;
            auVar65._12_4_ = 0x3effffff;
            for (; uVar47 != uVar16; uVar47 = uVar47 + 1) {
              if (lVar31 == 0) {
                auVar112 = ZEXT816(0) << 0x40;
              }
              else {
                auVar112 = ZEXT416(*(uint *)(lVar31 + uVar47 * 4));
              }
              pvVar46 = (void *)(top_blob->cstep * uVar47 * top_blob->elemsize +
                                (long)top_blob->data);
              fVar52 = local_90._M_impl.super__Vector_impl_data._M_start[uVar47 * 2];
              fVar51 = local_90._M_impl.super__Vector_impl_data._M_start[uVar47 * 2 + 1];
              pvVar49 = (void *)(local_2d8.cstep * uVar47 * local_2d8.elemsize +
                                (long)local_2d8.data);
              lVar48 = uVar47 * 9;
              lVar34 = (long)pvVar49 + (long)local_2d8.w;
              pvVar22 = (void *)((long)pvVar49 + (long)local_2d8.w * 2);
              for (iVar23 = 0; iVar23 != iVar24; iVar23 = iVar23 + 1) {
                lVar38 = 0;
                for (iVar37 = iVar42; 0 < iVar37; iVar37 = iVar37 + -1) {
                  auVar126._0_4_ =
                       (float)((int)*(char *)((long)pvVar4 + lVar48 + 8) *
                               (int)*(char *)((long)pvVar22 + lVar38 + 2) +
                               (int)*(char *)((long)pvVar4 + lVar48 + 7) *
                               (int)*(char *)((long)pvVar22 + lVar38 + 1) +
                              (int)*(char *)((long)pvVar4 + lVar48 + 6) *
                              (int)*(char *)((long)pvVar22 + lVar38) +
                              (int)*(char *)((long)pvVar4 + lVar48 + 5) *
                              (int)*(char *)(lVar34 + 2 + lVar38) +
                              (int)*(char *)((long)pvVar4 + lVar48 + 4) *
                              (int)*(char *)(lVar34 + 1 + lVar38) +
                              (int)*(char *)((long)pvVar4 + lVar48 + 3) *
                              (int)*(char *)(lVar34 + lVar38) +
                              (int)*(char *)((long)pvVar4 + lVar48 + 2) *
                              (int)*(char *)((long)pvVar49 + lVar38 + 2) +
                              (int)*(char *)((long)pvVar4 + lVar48 + 1) *
                              (int)*(char *)((long)pvVar49 + lVar38 + 1) +
                              (int)*(char *)((long)pvVar4 + lVar48) *
                              (int)*(char *)((long)pvVar49 + lVar38));
                  auVar126._4_12_ = auVar96;
                  auVar167 = vfmadd213ss_fma(auVar126,ZEXT416((uint)fVar52),auVar112);
                  fVar6 = auVar167._0_4_ * fVar51;
                  auVar167 = vandps_avx(ZEXT416((uint)fVar6),auVar53);
                  auVar167 = vorps_avx(auVar167,auVar65);
                  auVar167 = ZEXT416((uint)(fVar6 + auVar167._0_4_));
                  auVar167 = vroundss_avx(auVar167,auVar167,0xb);
                  iVar39 = (int)auVar167._0_4_;
                  if (iVar39 < -0x7e) {
                    iVar39 = -0x7f;
                  }
                  if (0x7e < iVar39) {
                    iVar39 = 0x7f;
                  }
                  *(char *)((long)pvVar46 + lVar38) = (char)iVar39;
                  lVar38 = lVar38 + 1;
                }
                pvVar49 = (void *)((long)pvVar49 + lVar38 + 2);
                lVar34 = lVar34 + lVar38 + 2;
                pvVar22 = (void *)((long)pvVar22 + lVar38 + 2);
                pvVar46 = (void *)((long)pvVar46 + lVar38);
              }
            }
            p_Var30 = &local_90;
LAB_0039f59b:
            std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(p_Var30);
            std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                      ((_Vector_base<float,_std::allocator<float>_> *)&opt_q);
          }
          iVar39 = 0;
          pLVar5 = this->activation;
          if (pLVar5 != (Layer *)0x0) {
            (*pLVar5->_vptr_Layer[9])(pLVar5,top_blob,opt);
          }
          goto LAB_0039ea1e;
        }
        iVar24 = 3;
        if ((((*(int *)(&this->field_0xdc + (long)p_Var13) == 1) &&
             ((*(int *)(&this->field_0xe0 + (long)p_Var13) == 1 &&
              (*(int *)(&this->field_0xe4 + (long)p_Var13) == 2)))) &&
            (*(int *)(&this->field_0xe8 + (long)p_Var13) == 2)) &&
           (*(uint *)(&this->field_0x110 + (long)p_Var13) < 2)) {
          if (100 < iVar2) {
            opt_q.lightmode = false;
            opt_q._1_3_ = 0;
            opt_q.num_threads = 0;
            opt_q.blob_allocator = (Allocator *)0x0;
            opt_q.workspace_allocator = (Allocator *)0x0;
            lVar31 = 0;
            while( true ) {
              auVar96 = in_ZMM7._4_12_;
              p_Var13 = pp_Var41[-3];
              if (*(int *)(&this->field_0x108 + (long)p_Var13) <= lVar31) break;
              fVar52 = *(float *)(*(long *)(&this->field_0x1f8 + (long)p_Var13) + lVar31 * 4);
              fVar51 = 0.0;
              if (fVar52 != 0.0) {
                fVar51 = 1.0 / (fVar52 * *(float *)(*(long *)(&this->field_0x240 + (long)p_Var13) +
                                                   lVar31 * 4));
              }
              _top_rescale = (void *)CONCAT44(iStack_264,fVar51);
              _scale_out = (void *)CONCAT44(uStack_1ac,
                                            *(undefined4 *)
                                             (*(long *)(&this->field_0x288 + (long)p_Var13) +
                                             lVar31 * 4));
              std::vector<float,_std::allocator<float>_>::push_back
                        ((vector<float,_std::allocator<float>_> *)&opt_q,&top_rescale);
              std::vector<float,_std::allocator<float>_>::push_back
                        ((vector<float,_std::allocator<float>_> *)&opt_q,&scale_out);
              lVar31 = lVar31 + 1;
              pp_Var41 = this->_vptr_ConvolutionDepthWise_x86_fma;
            }
            std::vector<float,_std::allocator<float>_>::vector
                      ((vector<float,_std::allocator<float>_> *)&local_c0,
                       (vector<float,_std::allocator<float>_> *)&opt_q);
            iVar42 = top_blob->w;
            pvVar4 = (this->weight_data_tm).data;
            lVar31 = *(long *)(&this->field_0x1b0 + (long)p_Var13);
            lVar34 = (long)((local_2d8.w - iVar42) * 2);
            uVar47 = 0;
            iVar24 = top_blob->h;
            if (top_blob->h < 1) {
              iVar24 = 0;
            }
            uVar16 = (ulong)(uint)top_blob->c;
            if (top_blob->c < 1) {
              uVar16 = uVar47;
            }
            auVar167._8_4_ = 0x80000000;
            auVar167._0_8_ = 0x8000000080000000;
            auVar167._12_4_ = 0x80000000;
            auVar162._8_4_ = 0x3effffff;
            auVar162._0_8_ = 0x3effffff3effffff;
            auVar162._12_4_ = 0x3effffff;
            for (; uVar47 != uVar16; uVar47 = uVar47 + 1) {
              if (lVar31 == 0) {
                auVar112 = ZEXT816(0) << 0x40;
              }
              else {
                auVar112 = ZEXT416(*(uint *)(lVar31 + uVar47 * 4));
              }
              puVar21 = (undefined1 *)
                        (top_blob->cstep * uVar47 * top_blob->elemsize + (long)top_blob->data);
              fVar52 = local_c0._M_impl.super__Vector_impl_data._M_start[uVar47 * 2];
              fVar51 = local_c0._M_impl.super__Vector_impl_data._M_start[uVar47 * 2 + 1];
              pvVar46 = (void *)(local_2d8.cstep * uVar47 * local_2d8.elemsize +
                                (long)local_2d8.data);
              lVar38 = uVar47 * 9;
              lVar48 = (long)pvVar46 + (long)local_2d8.w;
              pvVar22 = (void *)((long)pvVar46 + (long)local_2d8.w * 2);
              for (iVar23 = 0; iVar23 != iVar24; iVar23 = iVar23 + 1) {
                lVar36 = 0;
                for (iVar37 = iVar42; 0 < iVar37; iVar37 = iVar37 + -1) {
                  auVar127._0_4_ =
                       (float)((int)*(char *)((long)pvVar4 + lVar38 + 8) *
                               (int)*(char *)((long)pvVar22 + lVar36 + 2) +
                               (int)*(char *)((long)pvVar4 + lVar38 + 7) *
                               (int)*(char *)((long)pvVar22 + lVar36 + 1) +
                              (int)*(char *)((long)pvVar4 + lVar38 + 6) *
                              (int)*(char *)((long)pvVar22 + lVar36) +
                              (int)*(char *)((long)pvVar4 + lVar38 + 5) *
                              (int)*(char *)(lVar48 + 2 + lVar36) +
                              (int)*(char *)((long)pvVar4 + lVar38 + 4) *
                              (int)*(char *)(lVar48 + 1 + lVar36) +
                              (int)*(char *)((long)pvVar4 + lVar38 + 3) *
                              (int)*(char *)(lVar48 + lVar36) +
                              (int)*(char *)((long)pvVar4 + lVar38 + 2) *
                              (int)*(char *)((long)pvVar46 + lVar36 + 2) +
                              (int)*(char *)((long)pvVar4 + lVar38 + 1) *
                              (int)*(char *)((long)pvVar46 + lVar36 + 1) +
                              (int)*(char *)((long)pvVar4 + lVar38) *
                              (int)*(char *)((long)pvVar46 + lVar36));
                  auVar127._4_12_ = auVar96;
                  auVar127 = vfmadd213ss_fma(auVar127,ZEXT416((uint)fVar52),auVar112);
                  fVar6 = auVar127._0_4_ * fVar51;
                  auVar127 = vandps_avx(ZEXT416((uint)fVar6),auVar167);
                  auVar127 = vorps_avx(auVar127,auVar162);
                  auVar127 = ZEXT416((uint)(fVar6 + auVar127._0_4_));
                  auVar127 = vroundss_avx(auVar127,auVar127,0xb);
                  iVar39 = (int)auVar127._0_4_;
                  if (iVar39 < -0x7e) {
                    iVar39 = -0x7f;
                  }
                  if (0x7e < iVar39) {
                    iVar39 = 0x7f;
                  }
                  *puVar21 = (char)iVar39;
                  puVar21 = puVar21 + 1;
                  lVar36 = lVar36 + 2;
                }
                pvVar46 = (void *)((long)pvVar46 + lVar36 + lVar34);
                lVar48 = lVar48 + lVar34 + lVar36;
                pvVar22 = (void *)((long)pvVar22 + lVar36 + lVar34);
              }
            }
            p_Var30 = &local_c0;
            goto LAB_0039f59b;
          }
          opt_q.workspace_allocator = (Allocator *)0x0;
          opt_q.lightmode = false;
          opt_q._1_3_ = 0;
          opt_q.num_threads = 0;
          opt_q.blob_allocator = (Allocator *)0x0;
          lVar31 = 0;
          while( true ) {
            auVar96 = in_ZMM2._4_12_;
            p_Var13 = pp_Var41[-3];
            if (*(int *)(&this->field_0x108 + (long)p_Var13) <= lVar31) break;
            _top_rescale = (void *)CONCAT44(iStack_264,
                                            1.0 / (*(float *)(*(long *)(&this->field_0x1f8 +
                                                                       (long)p_Var13) + lVar31 * 4)
                                                  * *(float *)(*(long *)(&this->field_0x240 +
                                                                        (long)p_Var13) + lVar31 * 4)
                                                  ));
            std::vector<float,_std::allocator<float>_>::push_back
                      ((vector<float,_std::allocator<float>_> *)&opt_q,&top_rescale);
            lVar31 = lVar31 + 1;
            pp_Var41 = this->_vptr_ConvolutionDepthWise_x86_fma;
          }
          std::vector<float,_std::allocator<float>_>::vector
                    ((vector<float,_std::allocator<float>_> *)&local_d8,
                     (vector<float,_std::allocator<float>_> *)&opt_q);
          iVar42 = top_blob->w;
          iVar24 = top_blob->h;
          pvVar4 = (this->weight_data_tm).data;
          lVar31 = *(long *)(&this->field_0x1b0 + (long)p_Var13);
          uVar47 = top_blob->elemsize;
          local_270 = (void *)(top_blob->cstep * uVar47);
          local_278 = (long)iVar24 * (long)iVar42;
          iVar23 = 0;
          if (0 < iVar24) {
            iVar23 = iVar24;
          }
          iVar24 = top_blob->d;
          local_280 = CONCAT44(local_280._4_4_,iVar24);
          local_288 = (_func_int **)top_blob->data;
          lVar34 = (long)((local_2d8.w - iVar42) * 2);
          uVar16 = (ulong)(uint)top_blob->c;
          if (top_blob->c < 1) {
            uVar16 = 0;
          }
          iVar37 = top_blob->dims;
          pp_Var41 = local_288;
          for (uVar29 = 0; uVar29 != uVar16; uVar29 = uVar29 + 1) {
            iVar39 = (int)((uVar47 * local_278 + 0xf & 0xfffffffffffffff0) / uVar47);
            if (iVar37 == 4) {
              iVar39 = (int)local_278;
            }
            if (lVar31 == 0) {
              uVar54 = 0;
            }
            else {
              uVar54 = *(undefined4 *)(lVar31 + uVar29 * 4);
            }
            pp_Var18 = (_func_int **)((long)local_270 * uVar29 + (long)local_288);
            fVar52 = local_d8._M_impl.super__Vector_impl_data._M_start[uVar29];
            iVar39 = iVar39 * iVar24;
            if (iVar39 < 1) {
              iVar39 = 0;
            }
            for (lVar48 = 0; iVar39 != (int)lVar48; lVar48 = lVar48 + 1) {
              *(undefined4 *)((long)pp_Var41 + lVar48 * 4) = uVar54;
            }
            lVar38 = uVar29 * 9;
            pvVar46 = (void *)(local_2d8.elemsize * local_2d8.cstep * uVar29 + (long)local_2d8.data)
            ;
            lVar48 = (long)pvVar46 + (long)local_2d8.w;
            pvVar22 = (void *)((long)pvVar46 + (long)local_2d8.w * 2);
            for (iVar39 = 0; iVar39 != iVar23; iVar39 = iVar39 + 1) {
              lVar36 = 0;
              for (iVar25 = iVar42; 0 < iVar25; iVar25 = iVar25 + -1) {
                auVar112._0_4_ =
                     (float)((int)*(char *)((long)pvVar4 + lVar38 + 8) *
                             (int)*(char *)((long)pvVar22 + lVar36 + 2) +
                             (int)*(char *)((long)pvVar4 + lVar38 + 7) *
                             (int)*(char *)((long)pvVar22 + lVar36 + 1) +
                            (int)*(char *)((long)pvVar4 + lVar38 + 6) *
                            (int)*(char *)((long)pvVar22 + lVar36) +
                            (int)*(char *)((long)pvVar4 + lVar38 + 5) *
                            (int)*(char *)(lVar48 + 2 + lVar36) +
                            (int)*(char *)((long)pvVar4 + lVar38 + 4) *
                            (int)*(char *)(lVar48 + 1 + lVar36) +
                            (int)*(char *)((long)pvVar4 + lVar38 + 3) *
                            (int)*(char *)(lVar48 + lVar36) +
                            (int)*(char *)((long)pvVar4 + lVar38 + 2) *
                            (int)*(char *)((long)pvVar46 + lVar36 + 2) +
                            (int)*(char *)((long)pvVar4 + lVar38 + 1) *
                            (int)*(char *)((long)pvVar46 + lVar36 + 1) +
                            (int)*(char *)((long)pvVar4 + lVar38) *
                            (int)*(char *)((long)pvVar46 + lVar36));
                auVar112._4_12_ = auVar96;
                auVar112 = vfmadd213ss_fma(auVar112,ZEXT416((uint)fVar52),ZEXT416(*(uint *)pp_Var18)
                                          );
                *(uint *)pp_Var18 = auVar112._0_4_;
                pp_Var18 = (_func_int **)((long)pp_Var18 + 4);
                lVar36 = lVar36 + 2;
              }
              pvVar46 = (void *)((long)pvVar46 + lVar36 + lVar34);
              lVar48 = lVar48 + lVar34 + lVar36;
              pvVar22 = (void *)((long)pvVar22 + lVar36 + lVar34);
            }
            pp_Var41 = (_func_int **)((long)pp_Var41 + (long)local_270);
          }
          p_Var30 = &local_d8;
          goto LAB_0039f350;
        }
      }
      uVar43 = iVar24 * *(int *)(&this->field_0xd4 + (long)p_Var13);
      local_280 = (size_type)(int)uVar43;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&opt_q,local_280,
                 (allocator_type *)&top_rescale);
      uVar9 = opt_q._0_8_;
      local_288 = this->_vptr_ConvolutionDepthWise_x86_fma;
      p_Var13 = local_288[-3];
      iVar24 = *(int *)(&this->field_0xe0 + (long)p_Var13);
      iVar37 = *(int *)(&this->field_0xdc + (long)p_Var13);
      iVar39 = *(int *)(&this->field_0xd4 + (long)p_Var13);
      lVar31 = 0;
      iVar25 = 0;
      for (iVar26 = 0; iVar26 < *(int *)(&this->field_0xd8 + (long)p_Var13); iVar26 = iVar26 + 1) {
        for (lVar34 = 0; (int)lVar34 < *(int *)(&this->field_0xd4 + (long)p_Var13);
            lVar34 = lVar34 + 1) {
          *(int *)(opt_q._0_8_ + (long)(int)lVar31 * 4 + lVar34 * 4) = iVar25;
          p_Var13 = local_288[-3];
          iVar25 = iVar25 + *(int *)(&this->field_0xdc + (long)p_Var13);
        }
        iVar25 = iVar25 + (iVar7 * iVar24 - iVar37 * iVar39);
        lVar31 = (int)lVar31 + lVar34;
      }
      local_2f8 = 0;
      if ((int)uVar43 < 1) {
        uVar43 = 0;
      }
      auVar110 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
      for (uVar47 = 0; pvVar4 = local_2d8.data,
          (long)uVar47 < (long)*(int *)(&this->field_0x108 + (long)p_Var13); uVar47 = uVar47 + 1) {
        pfVar35 = (float *)(top_blob->elemsize * uVar47 * top_blob->cstep + (long)top_blob->data);
        lVar34 = local_2d8.cstep * uVar47 * local_2d8.elemsize;
        lVar31 = (long)local_2d8.w * local_2d8.elemsize;
        pvVar22 = (this->weight_data_tm).data;
        local_330 = pfVar35;
        local_278 = uVar47;
        for (iVar24 = 0; iVar24 <= iVar42; iVar24 = iVar24 + 1) {
          pp_Var41 = this->_vptr_ConvolutionDepthWise_x86_fma;
          for (iVar37 = 0; iVar37 <= iVar23; iVar37 = iVar37 + 1) {
            p_Var13 = pp_Var41[-3];
            iVar39 = 0;
            for (uVar16 = 0; uVar43 != uVar16; uVar16 = uVar16 + 1) {
              iVar39 = iVar39 + (int)*(char *)((long)pvVar22 + uVar16 + local_2f8) *
                                (int)*(char *)((long)pvVar4 +
                                              (long)*(int *)(uVar9 + uVar16 * 4) +
                                              (long)iVar24 *
                                              (long)*(int *)(&this->field_0xe8 + (long)p_Var13) *
                                              lVar31 + (long)iVar37 *
                                                       (long)*(int *)(&this->field_0xe4 +
                                                                     (long)p_Var13) + lVar34);
            }
            fVar52 = *(float *)(*(long *)(&this->field_0x1f8 + (long)p_Var13) + uVar47 * 4);
            fVar51 = 0.0;
            if (fVar52 != 0.0) {
              fVar51 = 1.0 / (fVar52 * *(float *)(*(long *)(&this->field_0x240 + (long)p_Var13) +
                                                 uVar47 * 4));
            }
            fVar51 = fVar51 * (float)iVar39;
            if (*(int *)(&this->field_0x100 + (long)p_Var13) != 0) {
              fVar51 = fVar51 + *(float *)(*(long *)(&this->field_0x1b0 + (long)p_Var13) +
                                          uVar47 * 4);
            }
            auVar112 = ZEXT416((uint)fVar51);
            fVar52 = fVar51;
            switch(*(undefined4 *)(&this->field_0x110 + (long)p_Var13)) {
            case 1:
              auVar112 = vmaxss_avx(auVar112,ZEXT416(0));
              fVar52 = auVar112._0_4_;
              break;
            case 2:
              auVar112 = vcmpss_avx(ZEXT816(0) << 0x20,auVar112,1);
              auVar94._8_4_ = 0x3f800000;
              auVar94._0_8_ = 0x3f8000003f800000;
              auVar94._12_4_ = 0x3f800000;
              auVar112 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0x118 + (long)p_Var13)),
                                       auVar94,auVar112);
              fVar52 = auVar112._0_4_ * fVar51;
              break;
            case 3:
              fVar51 = (float)(*(uint **)(&this->field_0x118 + (long)p_Var13))[1];
              auVar112 = vmaxss_avx(auVar112,ZEXT416(**(uint **)(&this->field_0x118 + (long)p_Var13)
                                                    ));
              fVar52 = auVar112._0_4_;
              if (fVar51 < auVar112._0_4_) {
                fVar52 = fVar51;
              }
              break;
            case 4:
              auVar112 = vminss_avx(auVar112,ZEXT416(0x42b0c0a5));
              auVar63._0_4_ = auVar112._0_4_ ^ auVar110._0_4_;
              auVar63._4_4_ = auVar112._4_4_ ^ auVar110._4_4_;
              auVar63._8_4_ = auVar112._8_4_ ^ auVar110._8_4_;
              auVar63._12_4_ = auVar112._12_4_ ^ auVar110._12_4_;
              auVar112 = vcmpss_avx(auVar112,ZEXT416(0xc2b0c0a5),1);
              auVar93._8_4_ = 0x42b0c0a5;
              auVar93._0_8_ = 0x42b0c0a542b0c0a5;
              auVar93._12_4_ = 0x42b0c0a5;
              auVar112 = vblendvps_avx(auVar63,auVar93,auVar112);
              fVar52 = expf(auVar112._0_4_);
              auVar110 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
              uVar47 = local_278;
              fVar52 = 1.0 / (fVar52 + 1.0);
              break;
            case 5:
              local_270 = (void *)CONCAT44(local_270._4_4_,fVar51);
              fVar52 = expf(fVar51);
              fVar52 = logf(fVar52 + 1.0);
              fVar52 = tanhf(fVar52);
              auVar110 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
              fVar52 = fVar52 * local_270._0_4_;
              break;
            case 6:
              fVar6 = **(float **)(&this->field_0x118 + (long)p_Var13);
              fVar1 = (*(float **)(&this->field_0x118 + (long)p_Var13))[1];
              fVar97 = (float)((uint)fVar1 ^ auVar110._0_4_) / fVar6;
              fVar52 = 0.0;
              if ((fVar97 <= fVar51) && (fVar52 = fVar51, fVar51 <= fVar97 + 1.0 / fVar6)) {
                auVar112 = vfmadd213ss_fma(ZEXT416((uint)fVar6),auVar112,ZEXT416((uint)fVar1));
                fVar52 = auVar112._0_4_ * fVar51;
              }
            }
            if (iVar2 < 0x65) {
              *local_330 = fVar52;
              local_330 = local_330 + 1;
            }
            else {
              fVar52 = fVar52 * *(float *)(*(long *)(&this->field_0x288 + (long)p_Var13) +
                                          uVar47 * 4);
              auVar112 = vandps_avx(ZEXT416((uint)fVar52),auVar110._0_16_);
              auVar95._8_4_ = 0x3effffff;
              auVar95._0_8_ = 0x3effffff3effffff;
              auVar95._12_4_ = 0x3effffff;
              auVar112 = vorps_avx(auVar112,auVar95);
              auVar112 = ZEXT416((uint)(fVar52 + auVar112._0_4_));
              auVar112 = vroundss_avx(auVar112,auVar112,0xb);
              iVar39 = (int)auVar112._0_4_;
              if (iVar39 < -0x7e) {
                iVar39 = -0x7f;
              }
              uVar12 = (undefined1)iVar39;
              if (0x7e < iVar39) {
                uVar12 = 0x7f;
              }
              *(undefined1 *)pfVar35 = uVar12;
              pfVar35 = (float *)((long)pfVar35 + 1);
            }
          }
        }
        p_Var13 = local_288[-3];
        local_2f8 = local_2f8 + local_280;
      }
    }
    else {
      if (iVar25 != 8) goto LAB_0039ea1e;
      uVar47 = (long)*(int *)(&this->field_0xd8 + (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3]
                             ) *
               (long)*(int *)(&this->field_0xd4 + (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3]
                             );
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&opt_q,uVar47,(allocator_type *)&top_rescale);
      pp_Var41 = this->_vptr_ConvolutionDepthWise_x86_fma;
      p_Var13 = pp_Var41[-3];
      iVar24 = *(int *)(&this->field_0xe0 + (long)p_Var13);
      iVar37 = *(int *)(&this->field_0xdc + (long)p_Var13);
      iVar39 = *(int *)(&this->field_0xd4 + (long)p_Var13);
      iVar28 = 0;
      lVar31 = 0;
      for (iVar25 = 0; iVar25 < *(int *)(&this->field_0xd8 + (long)p_Var13); iVar25 = iVar25 + 1) {
        for (lVar34 = 0; (int)lVar34 < *(int *)(&this->field_0xd4 + (long)p_Var13);
            lVar34 = lVar34 + 1) {
          *(int *)(opt_q._0_8_ + (long)(int)lVar31 * 4 + lVar34 * 4) = iVar28;
          p_Var13 = pp_Var41[-3];
          iVar28 = iVar28 + *(int *)(&this->field_0xdc + (long)p_Var13);
        }
        iVar28 = iVar28 + (iVar7 * iVar24 - iVar37 * iVar39);
        lVar31 = (int)lVar31 + lVar34;
      }
      uVar29 = 0;
      uVar16 = uVar47 & 0xffffffff;
      if ((int)uVar47 < 1) {
        uVar16 = uVar29;
      }
      uVar45 = (ulong)(uint)iVar26;
      if (iVar26 < 1) {
        uVar45 = uVar29;
      }
      for (uVar27 = 0; uVar27 != uVar45; uVar27 = uVar27 + 1) {
        pauVar32 = (undefined1 (*) [16])
                   (top_blob->elemsize * uVar27 * top_blob->cstep + (long)top_blob->data);
        pvVar4 = (this->weight_data_tm).data;
        pauVar33 = pauVar32;
        for (iVar24 = 0; iVar24 <= iVar42; iVar24 = iVar24 + 1) {
          pp_Var41 = this->_vptr_ConvolutionDepthWise_x86_fma;
          for (iVar37 = 0; iVar37 <= iVar23; iVar37 = iVar37 + 1) {
            p_Var13 = pp_Var41[-3];
            auVar110 = ZEXT1664((undefined1  [16])0x0);
            uVar40 = 0;
            auVar120 = ZEXT1664((undefined1  [16])0x0);
            while( true ) {
              if (uVar16 == uVar40) break;
              auVar121._8_8_ = 0;
              auVar121._0_8_ =
                   *(ulong *)((long)local_2d8.data +
                             (long)*(int *)(opt_q._0_8_ + uVar40 * 4) * 8 +
                             (long)iVar24 * (long)*(int *)(&this->field_0xe8 + (long)p_Var13) *
                             (long)local_2d8.w * local_2d8.elemsize +
                             (long)(*(int *)(&this->field_0xe4 + (long)p_Var13) * iVar37 * 8) +
                             local_2d8.cstep * uVar27 * local_2d8.elemsize);
              auVar112 = vpcmpgtb_avx((undefined1  [16])0x0,auVar121);
              auVar162 = vpunpcklbw_avx(auVar121,auVar112);
              auVar128._8_8_ = 0;
              auVar128._0_8_ = *(ulong *)((long)pvVar4 + uVar40 * 8 + (long)(int)uVar29);
              auVar112 = vpcmpgtb_avx((undefined1  [16])0x0,auVar128);
              auVar112 = vpunpcklbw_avx(auVar128,auVar112);
              auVar167 = vpmullw_avx(auVar112,auVar162);
              auVar112 = vpmulhw_avx(auVar162,auVar112);
              auVar162 = vpunpcklwd_avx(auVar167,auVar112);
              auVar167 = vpunpckhwd_avx(auVar167,auVar112);
              auVar112 = vpaddd_avx(auVar120._0_16_,auVar162);
              auVar120 = ZEXT1664(auVar112);
              auVar112 = vpaddd_avx(auVar110._0_16_,auVar167);
              auVar110 = ZEXT1664(auVar112);
              uVar40 = uVar40 + 1;
            }
            auVar112 = *(undefined1 (*) [16])
                        (*(long *)(&this->field_0x1f8 + (long)p_Var13) + uVar27 * 0x20);
            auVar167 = *(undefined1 (*) [16])
                        (*(long *)(&this->field_0x1f8 + (long)p_Var13) + 0x10 + uVar27 * 0x20);
            pfVar35 = (float *)(*(long *)(&this->field_0x240 + (long)p_Var13) + uVar27 * 0x20);
            auVar158._0_4_ = auVar112._0_4_ * *pfVar35;
            auVar158._4_4_ = auVar112._4_4_ * pfVar35[1];
            auVar158._8_4_ = auVar112._8_4_ * pfVar35[2];
            auVar158._12_4_ = auVar112._12_4_ * pfVar35[3];
            pfVar35 = (float *)(*(long *)(&this->field_0x240 + (long)p_Var13) + 0x10 + uVar27 * 0x20
                               );
            auVar188._0_4_ = auVar167._0_4_ * *pfVar35;
            auVar188._4_4_ = auVar167._4_4_ * pfVar35[1];
            auVar188._8_4_ = auVar167._8_4_ * pfVar35[2];
            auVar188._12_4_ = auVar167._12_4_ * pfVar35[3];
            auVar162 = vrcpps_avx(auVar158);
            auVar127 = vrcpps_avx(auVar188);
            auVar112 = vcmpps_avx(auVar112,(undefined1  [16])0x0,4);
            auVar112 = vandps_avx(auVar162,auVar112);
            auVar167 = vcmpps_avx(auVar167,(undefined1  [16])0x0,4);
            auVar167 = vandps_avx(auVar127,auVar167);
            auVar162 = vcvtdq2ps_avx(auVar120._0_16_);
            auVar122._0_4_ = auVar112._0_4_ * auVar162._0_4_;
            auVar122._4_4_ = auVar112._4_4_ * auVar162._4_4_;
            auVar122._8_4_ = auVar112._8_4_ * auVar162._8_4_;
            auVar122._12_4_ = auVar112._12_4_ * auVar162._12_4_;
            auVar112 = vcvtdq2ps_avx(auVar110._0_16_);
            auVar129._0_4_ = auVar167._0_4_ * auVar112._0_4_;
            auVar129._4_4_ = auVar167._4_4_ * auVar112._4_4_;
            auVar129._8_4_ = auVar167._8_4_ * auVar112._8_4_;
            auVar129._12_4_ = auVar167._12_4_ * auVar112._12_4_;
            if (*(int *)(&this->field_0x100 + (long)p_Var13) != 0) {
              pfVar35 = (float *)(*(long *)(&this->field_0x1b0 + (long)p_Var13) + uVar27 * 0x20);
              auVar122._0_4_ = auVar122._0_4_ + *pfVar35;
              auVar122._4_4_ = auVar122._4_4_ + pfVar35[1];
              auVar122._8_4_ = auVar122._8_4_ + pfVar35[2];
              auVar122._12_4_ = auVar122._12_4_ + pfVar35[3];
              pfVar35 = (float *)(*(long *)(&this->field_0x1b0 + (long)p_Var13) + 0x10 +
                                 uVar27 * 0x20);
              auVar129._0_4_ = auVar129._0_4_ + *pfVar35;
              auVar129._4_4_ = auVar129._4_4_ + pfVar35[1];
              auVar129._8_4_ = auVar129._8_4_ + pfVar35[2];
              auVar129._12_4_ = auVar129._12_4_ + pfVar35[3];
            }
            auVar117 = auVar122;
            auVar107 = auVar129;
            if (*(int *)(&this->field_0x110 + (long)p_Var13) - 1U < 6) {
              auVar117 = vmaxps_avx(auVar122,(undefined1  [16])0x0);
              auVar107 = vmaxps_avx(auVar129,(undefined1  [16])0x0);
              switch(*(int *)(&this->field_0x110 + (long)p_Var13)) {
              case 2:
                auVar112 = vminps_avx(auVar122,(undefined1  [16])0x0);
                uVar54 = **(undefined4 **)(&this->field_0x118 + (long)p_Var13);
                auVar159._4_4_ = uVar54;
                auVar159._0_4_ = uVar54;
                auVar159._8_4_ = uVar54;
                auVar159._12_4_ = uVar54;
                auVar117 = vfmadd231ps_fma(auVar117,auVar159,auVar112);
                auVar112 = vminps_avx(auVar129,(undefined1  [16])0x0);
                auVar107 = vfmadd231ps_fma(auVar107,auVar159,auVar112);
                break;
              case 3:
                uVar54 = **(undefined4 **)(&this->field_0x118 + (long)p_Var13);
                auVar102._4_4_ = uVar54;
                auVar102._0_4_ = uVar54;
                auVar102._8_4_ = uVar54;
                auVar102._12_4_ = uVar54;
                uVar54 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var13))[1];
                auVar172._4_4_ = uVar54;
                auVar172._0_4_ = uVar54;
                auVar172._8_4_ = uVar54;
                auVar172._12_4_ = uVar54;
                auVar112 = vmaxps_avx(auVar122,auVar102);
                auVar117 = vminps_avx(auVar172,auVar112);
                auVar112 = vmaxps_avx(auVar129,auVar102);
                auVar107 = vminps_avx(auVar172,auVar112);
                break;
              case 4:
                auVar103._0_8_ = auVar122._0_8_ ^ 0x8000000080000000;
                auVar103._8_4_ = -auVar122._8_4_;
                auVar103._12_4_ = -auVar122._12_4_;
                auVar153._8_4_ = 0x42b0c0a5;
                auVar153._0_8_ = 0x42b0c0a542b0c0a5;
                auVar153._12_4_ = 0x42b0c0a5;
                auVar112 = vminps_avx(auVar153,auVar103);
                auVar157._8_4_ = 0xc2b0c0a5;
                auVar157._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar157._12_4_ = 0xc2b0c0a5;
                auVar162 = vmaxps_avx(auVar157,auVar112);
                auVar148._8_4_ = 0x3fb8aa3b;
                auVar148._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar148._12_4_ = 0x3fb8aa3b;
                auVar59._8_4_ = 0x3f000000;
                auVar59._0_8_ = 0x3f0000003f000000;
                auVar59._12_4_ = 0x3f000000;
                auVar112 = vfmadd213ps_fma(auVar148,auVar162,auVar59);
                auVar116._0_4_ = (int)auVar112._0_4_;
                auVar116._4_4_ = (int)auVar112._4_4_;
                auVar116._8_4_ = (int)auVar112._8_4_;
                auVar116._12_4_ = (int)auVar112._12_4_;
                auVar167 = vcvtdq2ps_avx(auVar116);
                auVar112 = vcmpps_avx(auVar112,auVar167,1);
                auVar92._8_4_ = 0x3f800000;
                auVar92._0_8_ = 0x3f8000003f800000;
                auVar92._12_4_ = 0x3f800000;
                auVar112 = vandps_avx(auVar112,auVar92);
                auVar127 = vsubps_avx(auVar167,auVar112);
                auVar143._8_4_ = 0x3f318000;
                auVar143._0_8_ = 0x3f3180003f318000;
                auVar143._12_4_ = 0x3f318000;
                auVar112 = vfmsub231ps_fma(auVar162,auVar127,auVar143);
                auVar194._8_4_ = 0xb95e8083;
                auVar194._0_8_ = 0xb95e8083b95e8083;
                auVar194._12_4_ = 0xb95e8083;
                auVar167 = vfnmsub231ps_fma(auVar112,auVar127,auVar194);
                auVar173._0_4_ = auVar167._0_4_ * auVar167._0_4_;
                auVar173._4_4_ = auVar167._4_4_ * auVar167._4_4_;
                auVar173._8_4_ = auVar167._8_4_ * auVar167._8_4_;
                auVar173._12_4_ = auVar167._12_4_ * auVar167._12_4_;
                auVar187._8_4_ = 0x39506967;
                auVar187._0_8_ = 0x3950696739506967;
                auVar187._12_4_ = 0x39506967;
                auVar198._8_4_ = 0x3ab743ce;
                auVar198._0_8_ = 0x3ab743ce3ab743ce;
                auVar198._12_4_ = 0x3ab743ce;
                auVar112 = vfmadd213ps_fma(auVar187,auVar167,auVar198);
                auVar200._8_4_ = 0x3c088908;
                auVar200._0_8_ = 0x3c0889083c088908;
                auVar200._12_4_ = 0x3c088908;
                auVar112 = vfmadd213ps_fma(auVar112,auVar167,auVar200);
                auVar144._8_4_ = 0x3d2aa9c1;
                auVar144._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar144._12_4_ = 0x3d2aa9c1;
                auVar112 = vfmadd213ps_fma(auVar112,auVar167,auVar144);
                auVar145._8_4_ = 0x3e2aaaaa;
                auVar145._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar145._12_4_ = 0x3e2aaaaa;
                auVar112 = vfmadd213ps_fma(auVar112,auVar167,auVar145);
                auVar112 = vfmadd213ps_fma(auVar112,auVar167,auVar59);
                auVar53 = vfmadd213ps_fma(auVar112,auVar173,auVar167);
                auVar123._0_8_ = auVar129._0_8_ ^ 0x8000000080000000;
                auVar123._8_4_ = -auVar129._8_4_;
                auVar123._12_4_ = -auVar129._12_4_;
                auVar112 = vminps_avx(auVar153,auVar123);
                auVar162 = vmaxps_avx(auVar157,auVar112);
                auVar112 = vfmadd213ps_fma(auVar148,auVar162,auVar59);
                auVar174._0_4_ = (int)auVar112._0_4_;
                auVar174._4_4_ = (int)auVar112._4_4_;
                auVar174._8_4_ = (int)auVar112._8_4_;
                auVar174._12_4_ = (int)auVar112._12_4_;
                auVar167 = vcvtdq2ps_avx(auVar174);
                auVar112 = vcmpps_avx(auVar112,auVar167,1);
                auVar112 = vandps_avx(auVar112,auVar92);
                auVar167 = vsubps_avx(auVar167,auVar112);
                auVar149._8_4_ = 0x3f318000;
                auVar149._0_8_ = 0x3f3180003f318000;
                auVar149._12_4_ = 0x3f318000;
                auVar112 = vfmsub231ps_fma(auVar162,auVar167,auVar149);
                auVar162 = vfnmsub231ps_fma(auVar112,auVar167,auVar194);
                auVar175._0_4_ = auVar162._0_4_ * auVar162._0_4_;
                auVar175._4_4_ = auVar162._4_4_ * auVar162._4_4_;
                auVar175._8_4_ = auVar162._8_4_ * auVar162._8_4_;
                auVar175._12_4_ = auVar162._12_4_ * auVar162._12_4_;
                auVar112 = vfmadd213ps_fma(auVar187,auVar162,auVar198);
                auVar112 = vfmadd213ps_fma(auVar112,auVar162,auVar200);
                auVar150._8_4_ = 0x3d2aa9c1;
                auVar150._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar150._12_4_ = 0x3d2aa9c1;
                auVar112 = vfmadd213ps_fma(auVar112,auVar162,auVar150);
                auVar112 = vfmadd213ps_fma(auVar112,auVar162,auVar145);
                auVar112 = vfmadd213ps_fma(auVar112,auVar162,auVar59);
                auVar162 = vfmadd213ps_fma(auVar112,auVar175,auVar162);
                auVar124._0_4_ = auVar53._0_4_ + 1.0;
                auVar124._4_4_ = auVar53._4_4_ + 1.0;
                auVar124._8_4_ = auVar53._8_4_ + 1.0;
                auVar124._12_4_ = auVar53._12_4_ + 1.0;
                auVar104._0_4_ = (int)auVar127._0_4_;
                auVar104._4_4_ = (int)auVar127._4_4_;
                auVar104._8_4_ = (int)auVar127._8_4_;
                auVar104._12_4_ = (int)auVar127._12_4_;
                auVar112 = vpslld_avx(auVar104,0x17);
                auVar112 = vpaddd_avx(auVar112,auVar92);
                auVar127 = vfmadd213ps_fma(auVar112,auVar124,auVar92);
                auVar112 = vrcpps_avx(auVar127);
                auVar127 = vfmsub213ps_fma(auVar127,auVar112,auVar92);
                auVar117 = vfnmadd132ps_fma(auVar127,auVar112,auVar112);
                auVar125._0_4_ = auVar162._0_4_ + 1.0;
                auVar125._4_4_ = auVar162._4_4_ + 1.0;
                auVar125._8_4_ = auVar162._8_4_ + 1.0;
                auVar125._12_4_ = auVar162._12_4_ + 1.0;
                auVar105._0_4_ = (int)auVar167._0_4_;
                auVar105._4_4_ = (int)auVar167._4_4_;
                auVar105._8_4_ = (int)auVar167._8_4_;
                auVar105._12_4_ = (int)auVar167._12_4_;
                auVar112 = vpslld_avx(auVar105,0x17);
                auVar112 = vpaddd_avx(auVar112,auVar92);
                auVar167 = vfmadd213ps_fma(auVar112,auVar125,auVar92);
                auVar112 = vrcpps_avx(auVar167);
                auVar167 = vfmsub213ps_fma(auVar167,auVar112,auVar92);
                auVar107 = vfnmadd132ps_fma(auVar167,auVar112,auVar112);
                break;
              case 5:
                auVar55._8_4_ = 0x42b0c0a5;
                auVar55._0_8_ = 0x42b0c0a542b0c0a5;
                auVar55._12_4_ = 0x42b0c0a5;
                auVar112 = vminps_avx(auVar122,auVar55);
                auVar56._8_4_ = 0xc2b0c0a5;
                auVar56._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar56._12_4_ = 0xc2b0c0a5;
                auVar162 = vmaxps_avx(auVar112,auVar56);
                auVar199._8_4_ = 0x3fb8aa3b;
                auVar199._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar199._12_4_ = 0x3fb8aa3b;
                auVar147._8_4_ = 0x3f000000;
                auVar147._0_8_ = 0x3f0000003f000000;
                auVar147._12_4_ = 0x3f000000;
                auVar112 = vfmadd213ps_fma(auVar199,auVar162,auVar147);
                auVar160._0_4_ = (int)auVar112._0_4_;
                auVar160._4_4_ = (int)auVar112._4_4_;
                auVar160._8_4_ = (int)auVar112._8_4_;
                auVar160._12_4_ = (int)auVar112._12_4_;
                auVar167 = vcvtdq2ps_avx(auVar160);
                auVar112 = vcmpps_avx(auVar112,auVar167,1);
                auVar57._8_4_ = 0x3f800000;
                auVar57._0_8_ = 0x3f8000003f800000;
                auVar57._12_4_ = 0x3f800000;
                auVar112 = vandps_avx(auVar112,auVar57);
                auVar112 = vsubps_avx(auVar167,auVar112);
                auVar130._8_4_ = 0x3f318000;
                auVar130._0_8_ = 0x3f3180003f318000;
                auVar130._12_4_ = 0x3f318000;
                auVar167 = vfmsub231ps_fma(auVar162,auVar112,auVar130);
                auVar131._8_4_ = 0xb95e8083;
                auVar131._0_8_ = 0xb95e8083b95e8083;
                auVar131._12_4_ = 0xb95e8083;
                auVar162 = vfnmsub231ps_fma(auVar167,auVar112,auVar131);
                auVar161._0_4_ = auVar162._0_4_ * auVar162._0_4_;
                auVar161._4_4_ = auVar162._4_4_ * auVar162._4_4_;
                auVar161._8_4_ = auVar162._8_4_ * auVar162._8_4_;
                auVar161._12_4_ = auVar162._12_4_ * auVar162._12_4_;
                auVar189._8_4_ = 0x39506967;
                auVar189._0_8_ = 0x3950696739506967;
                auVar189._12_4_ = 0x39506967;
                auVar132._8_4_ = 0x3ab743ce;
                auVar132._0_8_ = 0x3ab743ce3ab743ce;
                auVar132._12_4_ = 0x3ab743ce;
                auVar167 = vfmadd213ps_fma(auVar189,auVar162,auVar132);
                auVar176._8_4_ = 0x3c088908;
                auVar176._0_8_ = 0x3c0889083c088908;
                auVar176._12_4_ = 0x3c088908;
                auVar167 = vfmadd213ps_fma(auVar167,auVar162,auVar176);
                auVar154._8_4_ = 0x3d2aa9c1;
                auVar154._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar154._12_4_ = 0x3d2aa9c1;
                auVar167 = vfmadd213ps_fma(auVar167,auVar162,auVar154);
                auVar133._8_4_ = 0x3e2aaaaa;
                auVar133._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar133._12_4_ = 0x3e2aaaaa;
                auVar167 = vfmadd213ps_fma(auVar167,auVar162,auVar133);
                auVar167 = vfmadd213ps_fma(auVar167,auVar162,auVar147);
                auVar167 = vfmadd213ps_fma(auVar167,auVar161,auVar162);
                auVar98._0_4_ = auVar167._0_4_ + 1.0;
                auVar98._4_4_ = auVar167._4_4_ + 1.0;
                auVar98._8_4_ = auVar167._8_4_ + 1.0;
                auVar98._12_4_ = auVar167._12_4_ + 1.0;
                auVar111._0_4_ = (int)auVar112._0_4_;
                auVar111._4_4_ = (int)auVar112._4_4_;
                auVar111._8_4_ = (int)auVar112._8_4_;
                auVar111._12_4_ = (int)auVar112._12_4_;
                auVar112 = vpslld_avx(auVar111,0x17);
                auVar112 = vpaddd_avx(auVar112,auVar57);
                auVar112 = vfmadd213ps_fma(auVar112,auVar98,auVar57);
                auVar167 = vcmpps_avx(auVar112,(undefined1  [16])0x0,2);
                auVar134._8_4_ = 0x800000;
                auVar134._0_8_ = 0x80000000800000;
                auVar134._12_4_ = 0x800000;
                auVar112 = vmaxps_avx(auVar112,auVar134);
                auVar162 = vpsrld_avx(auVar112,0x17);
                auVar135._8_4_ = 0x807fffff;
                auVar135._0_8_ = 0x807fffff807fffff;
                auVar135._12_4_ = 0x807fffff;
                auVar112 = vandps_avx(auVar112,auVar135);
                auVar53 = vorps_avx(auVar147,auVar112);
                auVar136._8_4_ = 0xffffff82;
                auVar136._0_8_ = 0xffffff82ffffff82;
                auVar136._12_4_ = 0xffffff82;
                auVar112 = vpaddd_avx(auVar162,auVar136);
                auVar127 = vcvtdq2ps_avx(auVar112);
                auVar137._8_4_ = 0x3f3504f3;
                auVar137._0_8_ = 0x3f3504f33f3504f3;
                auVar137._12_4_ = 0x3f3504f3;
                auVar162 = vcmpps_avx(auVar53,auVar137,1);
                auVar112 = vandps_avx(auVar162,auVar53);
                auVar113._0_4_ = auVar53._0_4_ + -1.0 + auVar112._0_4_;
                auVar113._4_4_ = auVar53._4_4_ + -1.0 + auVar112._4_4_;
                auVar113._8_4_ = auVar53._8_4_ + -1.0 + auVar112._8_4_;
                auVar113._12_4_ = auVar53._12_4_ + -1.0 + auVar112._12_4_;
                auVar112 = vandps_avx(auVar162,auVar57);
                auVar112 = vsubps_avx(auVar127,auVar112);
                auVar163._0_4_ = auVar113._0_4_ * auVar113._0_4_;
                auVar163._4_4_ = auVar113._4_4_ * auVar113._4_4_;
                auVar163._8_4_ = auVar113._8_4_ * auVar113._8_4_;
                auVar163._12_4_ = auVar113._12_4_ * auVar113._12_4_;
                auVar190._8_4_ = 0x3d9021bb;
                auVar190._0_8_ = 0x3d9021bb3d9021bb;
                auVar190._12_4_ = 0x3d9021bb;
                auVar177._8_4_ = 0xbdebd1b8;
                auVar177._0_8_ = 0xbdebd1b8bdebd1b8;
                auVar177._12_4_ = 0xbdebd1b8;
                auVar162 = vfmadd213ps_fma(auVar190,auVar113,auVar177);
                auVar178._8_4_ = 0x3def251a;
                auVar178._0_8_ = 0x3def251a3def251a;
                auVar178._12_4_ = 0x3def251a;
                auVar162 = vfmadd213ps_fma(auVar162,auVar113,auVar178);
                auVar179._8_4_ = 0xbdfe5d4f;
                auVar179._0_8_ = 0xbdfe5d4fbdfe5d4f;
                auVar179._12_4_ = 0xbdfe5d4f;
                auVar162 = vfmadd213ps_fma(auVar162,auVar113,auVar179);
                auVar180._8_4_ = 0x3e11e9bf;
                auVar180._0_8_ = 0x3e11e9bf3e11e9bf;
                auVar180._12_4_ = 0x3e11e9bf;
                auVar162 = vfmadd213ps_fma(auVar162,auVar113,auVar180);
                auVar181._8_4_ = 0xbe2aae50;
                auVar181._0_8_ = 0xbe2aae50be2aae50;
                auVar181._12_4_ = 0xbe2aae50;
                auVar162 = vfmadd213ps_fma(auVar162,auVar113,auVar181);
                auVar182._8_4_ = 0x3e4cceac;
                auVar182._0_8_ = 0x3e4cceac3e4cceac;
                auVar182._12_4_ = 0x3e4cceac;
                auVar162 = vfmadd213ps_fma(auVar162,auVar113,auVar182);
                auVar183._8_4_ = 0xbe7ffffc;
                auVar183._0_8_ = 0xbe7ffffcbe7ffffc;
                auVar183._12_4_ = 0xbe7ffffc;
                auVar162 = vfmadd213ps_fma(auVar162,auVar113,auVar183);
                auVar184._8_4_ = 0x3eaaaaaa;
                auVar184._0_8_ = 0x3eaaaaaa3eaaaaaa;
                auVar184._12_4_ = 0x3eaaaaaa;
                auVar162 = vfmadd213ps_fma(auVar162,auVar113,auVar184);
                auVar191._0_4_ = auVar163._0_4_ * auVar113._0_4_ * auVar162._0_4_;
                auVar191._4_4_ = auVar163._4_4_ * auVar113._4_4_ * auVar162._4_4_;
                auVar191._8_4_ = auVar163._8_4_ * auVar113._8_4_ * auVar162._8_4_;
                auVar191._12_4_ = auVar163._12_4_ * auVar113._12_4_ * auVar162._12_4_;
                auVar162 = vfmadd231ps_fma(auVar191,auVar112,auVar131);
                auVar162 = vfmsub231ps_fma(auVar162,auVar147,auVar163);
                auVar162 = vsubps_avx(auVar162,auVar113);
                auVar112 = vfmsub231ps_fma(auVar162,auVar130,auVar112);
                auVar114._0_4_ = auVar112._0_4_ * -2.0;
                auVar114._4_4_ = auVar112._4_4_ * -2.0;
                auVar114._8_4_ = auVar112._8_4_ * -2.0;
                auVar114._12_4_ = auVar112._12_4_ * -2.0;
                auVar66._8_4_ = 0x7fffffff;
                auVar66._0_8_ = 0x7fffffff7fffffff;
                auVar66._12_4_ = 0x7fffffff;
                auVar112 = vblendvps_avx(auVar114,auVar66,auVar167);
                auVar67._8_4_ = 0x42b0c0a5;
                auVar67._0_8_ = 0x42b0c0a542b0c0a5;
                auVar67._12_4_ = 0x42b0c0a5;
                auVar112 = vminps_avx(auVar112,auVar67);
                auVar68._8_4_ = 0xc2b0c0a5;
                auVar68._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar68._12_4_ = 0xc2b0c0a5;
                auVar162 = vmaxps_avx(auVar112,auVar68);
                auVar112 = vfmadd213ps_fma(auVar199,auVar162,auVar147);
                auVar138._0_4_ = (int)auVar112._0_4_;
                auVar138._4_4_ = (int)auVar112._4_4_;
                auVar138._8_4_ = (int)auVar112._8_4_;
                auVar138._12_4_ = (int)auVar112._12_4_;
                auVar167 = vcvtdq2ps_avx(auVar138);
                auVar112 = vcmpps_avx(auVar112,auVar167,1);
                auVar112 = vandps_avx(auVar112,auVar57);
                auVar112 = vsubps_avx(auVar167,auVar112);
                auVar167 = vfmsub231ps_fma(auVar162,auVar112,auVar130);
                auVar162 = vfnmsub231ps_fma(auVar167,auVar112,auVar131);
                auVar139._0_4_ = auVar162._0_4_ * auVar162._0_4_;
                auVar139._4_4_ = auVar162._4_4_ * auVar162._4_4_;
                auVar139._8_4_ = auVar162._8_4_ * auVar162._8_4_;
                auVar139._12_4_ = auVar162._12_4_ * auVar162._12_4_;
                auVar151._8_4_ = 0x39506967;
                auVar151._0_8_ = 0x3950696739506967;
                auVar151._12_4_ = 0x39506967;
                auVar195._8_4_ = 0x3ab743ce;
                auVar195._0_8_ = 0x3ab743ce3ab743ce;
                auVar195._12_4_ = 0x3ab743ce;
                auVar167 = vfmadd213ps_fma(auVar151,auVar162,auVar195);
                auVar155._8_4_ = 0x3c088908;
                auVar155._0_8_ = 0x3c0889083c088908;
                auVar155._12_4_ = 0x3c088908;
                auVar167 = vfmadd213ps_fma(auVar167,auVar162,auVar155);
                auVar69._8_4_ = 0x3d2aa9c1;
                auVar69._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar69._12_4_ = 0x3d2aa9c1;
                auVar167 = vfmadd213ps_fma(auVar167,auVar162,auVar69);
                auVar185._8_4_ = 0x3e2aaaaa;
                auVar185._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar185._12_4_ = 0x3e2aaaaa;
                auVar167 = vfmadd213ps_fma(auVar167,auVar162,auVar185);
                auVar167 = vfmadd213ps_fma(auVar167,auVar162,auVar147);
                auVar167 = vfmadd213ps_fma(auVar167,auVar139,auVar162);
                auVar99._0_4_ = auVar167._0_4_ + 1.0;
                auVar99._4_4_ = auVar167._4_4_ + 1.0;
                auVar99._8_4_ = auVar167._8_4_ + 1.0;
                auVar99._12_4_ = auVar167._12_4_ + 1.0;
                auVar115._0_4_ = (int)auVar112._0_4_;
                auVar115._4_4_ = (int)auVar112._4_4_;
                auVar115._8_4_ = (int)auVar112._8_4_;
                auVar115._12_4_ = (int)auVar112._12_4_;
                auVar112 = vpslld_avx(auVar115,0x17);
                auVar112 = vpaddd_avx(auVar112,auVar57);
                auVar167 = vfmadd213ps_fma(auVar112,auVar99,auVar57);
                auVar112 = vrcpps_avx(auVar167);
                auVar140._0_4_ = auVar112._0_4_ + auVar112._0_4_;
                auVar140._4_4_ = auVar112._4_4_ + auVar112._4_4_;
                auVar140._8_4_ = auVar112._8_4_ + auVar112._8_4_;
                auVar140._12_4_ = auVar112._12_4_ + auVar112._12_4_;
                auVar70._8_4_ = 0x40000000;
                auVar70._0_8_ = 0x4000000040000000;
                auVar70._12_4_ = 0x40000000;
                auVar167 = vfmsub213ps_fma(auVar167,auVar140,auVar70);
                auVar65 = vfnmadd213ps_fma(auVar167,auVar112,auVar140);
                auVar71._8_4_ = 0x42b0c0a5;
                auVar71._0_8_ = 0x42b0c0a542b0c0a5;
                auVar71._12_4_ = 0x42b0c0a5;
                auVar112 = vminps_avx(auVar129,auVar71);
                auVar72._8_4_ = 0xc2b0c0a5;
                auVar72._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar72._12_4_ = 0xc2b0c0a5;
                auVar162 = vmaxps_avx(auVar112,auVar72);
                auVar112 = vfmadd213ps_fma(auVar199,auVar162,auVar147);
                auVar164._0_4_ = (int)auVar112._0_4_;
                auVar164._4_4_ = (int)auVar112._4_4_;
                auVar164._8_4_ = (int)auVar112._8_4_;
                auVar164._12_4_ = (int)auVar112._12_4_;
                auVar167 = vcvtdq2ps_avx(auVar164);
                auVar112 = vcmpps_avx(auVar112,auVar167,1);
                auVar112 = vandps_avx(auVar112,auVar57);
                auVar112 = vsubps_avx(auVar167,auVar112);
                auVar73._8_4_ = 0x3f318000;
                auVar73._0_8_ = 0x3f3180003f318000;
                auVar73._12_4_ = 0x3f318000;
                auVar167 = vfmsub231ps_fma(auVar162,auVar112,auVar73);
                auVar162 = vfnmsub231ps_fma(auVar167,auVar112,auVar131);
                auVar165._0_4_ = auVar162._0_4_ * auVar162._0_4_;
                auVar165._4_4_ = auVar162._4_4_ * auVar162._4_4_;
                auVar165._8_4_ = auVar162._8_4_ * auVar162._8_4_;
                auVar165._12_4_ = auVar162._12_4_ * auVar162._12_4_;
                auVar167 = vfmadd213ps_fma(auVar151,auVar162,auVar195);
                auVar167 = vfmadd213ps_fma(auVar167,auVar162,auVar155);
                auVar156._8_4_ = 0x3d2aa9c1;
                auVar156._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar156._12_4_ = 0x3d2aa9c1;
                auVar167 = vfmadd213ps_fma(auVar167,auVar162,auVar156);
                auVar167 = vfmadd213ps_fma(auVar167,auVar162,auVar185);
                auVar167 = vfmadd213ps_fma(auVar167,auVar162,auVar147);
                auVar167 = vfmadd213ps_fma(auVar167,auVar165,auVar162);
                auVar166._0_4_ = auVar167._0_4_ + 1.0;
                auVar166._4_4_ = auVar167._4_4_ + 1.0;
                auVar166._8_4_ = auVar167._8_4_ + 1.0;
                auVar166._12_4_ = auVar167._12_4_ + 1.0;
                auVar100._0_4_ = (int)auVar112._0_4_;
                auVar100._4_4_ = (int)auVar112._4_4_;
                auVar100._8_4_ = (int)auVar112._8_4_;
                auVar100._12_4_ = (int)auVar112._12_4_;
                auVar112 = vpslld_avx(auVar100,0x17);
                auVar112 = vpaddd_avx(auVar112,auVar57);
                auVar53 = vfmadd213ps_fma(auVar112,auVar166,auVar57);
                auVar74._8_4_ = 0x800000;
                auVar74._0_8_ = 0x80000000800000;
                auVar74._12_4_ = 0x800000;
                auVar112 = vmaxps_avx(auVar53,auVar74);
                auVar167 = vpsrld_avx(auVar112,0x17);
                auVar75._8_4_ = 0x807fffff;
                auVar75._0_8_ = 0x807fffff807fffff;
                auVar75._12_4_ = 0x807fffff;
                auVar112 = vandps_avx(auVar112,auVar75);
                auVar127 = vorps_avx(auVar147,auVar112);
                auVar76._8_4_ = 0xffffff82;
                auVar76._0_8_ = 0xffffff82ffffff82;
                auVar76._12_4_ = 0xffffff82;
                auVar112 = vpaddd_avx(auVar167,auVar76);
                auVar162 = vcvtdq2ps_avx(auVar112);
                auVar77._8_4_ = 0x3f3504f3;
                auVar77._0_8_ = 0x3f3504f33f3504f3;
                auVar77._12_4_ = 0x3f3504f3;
                auVar167 = vcmpps_avx(auVar127,auVar77,1);
                auVar112 = vandps_avx(auVar167,auVar127);
                auVar141._0_4_ = auVar112._0_4_ + auVar127._0_4_ + -1.0;
                auVar141._4_4_ = auVar112._4_4_ + auVar127._4_4_ + -1.0;
                auVar141._8_4_ = auVar112._8_4_ + auVar127._8_4_ + -1.0;
                auVar141._12_4_ = auVar112._12_4_ + auVar127._12_4_ + -1.0;
                auVar112 = vandps_avx(auVar167,auVar57);
                auVar167 = vsubps_avx(auVar162,auVar112);
                auVar192._0_4_ = auVar141._0_4_ * auVar141._0_4_;
                auVar192._4_4_ = auVar141._4_4_ * auVar141._4_4_;
                auVar192._8_4_ = auVar141._8_4_ * auVar141._8_4_;
                auVar192._12_4_ = auVar141._12_4_ * auVar141._12_4_;
                auVar196._8_4_ = 0x3d9021bb;
                auVar196._0_8_ = 0x3d9021bb3d9021bb;
                auVar196._12_4_ = 0x3d9021bb;
                auVar78._8_4_ = 0xbdebd1b8;
                auVar78._0_8_ = 0xbdebd1b8bdebd1b8;
                auVar78._12_4_ = 0xbdebd1b8;
                auVar112 = vfmadd213ps_fma(auVar196,auVar141,auVar78);
                auVar79._8_4_ = 0x3def251a;
                auVar79._0_8_ = 0x3def251a3def251a;
                auVar79._12_4_ = 0x3def251a;
                auVar112 = vfmadd213ps_fma(auVar112,auVar141,auVar79);
                auVar80._8_4_ = 0xbdfe5d4f;
                auVar80._0_8_ = 0xbdfe5d4fbdfe5d4f;
                auVar80._12_4_ = 0xbdfe5d4f;
                auVar112 = vfmadd213ps_fma(auVar112,auVar141,auVar80);
                auVar81._8_4_ = 0x3e11e9bf;
                auVar81._0_8_ = 0x3e11e9bf3e11e9bf;
                auVar81._12_4_ = 0x3e11e9bf;
                auVar112 = vfmadd213ps_fma(auVar112,auVar141,auVar81);
                auVar82._8_4_ = 0xbe2aae50;
                auVar82._0_8_ = 0xbe2aae50be2aae50;
                auVar82._12_4_ = 0xbe2aae50;
                auVar112 = vfmadd213ps_fma(auVar112,auVar141,auVar82);
                auVar83._8_4_ = 0x3e4cceac;
                auVar83._0_8_ = 0x3e4cceac3e4cceac;
                auVar83._12_4_ = 0x3e4cceac;
                auVar112 = vfmadd213ps_fma(auVar112,auVar141,auVar83);
                auVar84._8_4_ = 0xbe7ffffc;
                auVar84._0_8_ = 0xbe7ffffcbe7ffffc;
                auVar84._12_4_ = 0xbe7ffffc;
                auVar112 = vfmadd213ps_fma(auVar112,auVar141,auVar84);
                auVar85._8_4_ = 0x3eaaaaaa;
                auVar85._0_8_ = 0x3eaaaaaa3eaaaaaa;
                auVar85._12_4_ = 0x3eaaaaaa;
                auVar112 = vfmadd213ps_fma(auVar112,auVar141,auVar85);
                auVar197._0_4_ = auVar192._0_4_ * auVar141._0_4_ * auVar112._0_4_;
                auVar197._4_4_ = auVar192._4_4_ * auVar141._4_4_ * auVar112._4_4_;
                auVar197._8_4_ = auVar192._8_4_ * auVar141._8_4_ * auVar112._8_4_;
                auVar197._12_4_ = auVar192._12_4_ * auVar141._12_4_ * auVar112._12_4_;
                auVar152._8_4_ = 0xb95e8083;
                auVar152._0_8_ = 0xb95e8083b95e8083;
                auVar152._12_4_ = 0xb95e8083;
                auVar112 = vfmadd231ps_fma(auVar197,auVar167,auVar152);
                auVar162 = vfmsub231ps_fma(auVar112,auVar147,auVar192);
                auVar112 = vcmpps_avx(auVar53,(undefined1  [16])0x0,2);
                auVar162 = vsubps_avx(auVar162,auVar141);
                auVar186._8_4_ = 0x3f318000;
                auVar186._0_8_ = 0x3f3180003f318000;
                auVar186._12_4_ = 0x3f318000;
                auVar167 = vfmsub231ps_fma(auVar162,auVar186,auVar167);
                auVar142._0_4_ = auVar167._0_4_ * -2.0;
                auVar142._4_4_ = auVar167._4_4_ * -2.0;
                auVar142._8_4_ = auVar167._8_4_ * -2.0;
                auVar142._12_4_ = auVar167._12_4_ * -2.0;
                auVar86._8_4_ = 0x7fffffff;
                auVar86._0_8_ = 0x7fffffff7fffffff;
                auVar86._12_4_ = 0x7fffffff;
                auVar112 = vblendvps_avx(auVar142,auVar86,auVar112);
                auVar87._8_4_ = 0x42b0c0a5;
                auVar87._0_8_ = 0x42b0c0a542b0c0a5;
                auVar87._12_4_ = 0x42b0c0a5;
                auVar112 = vminps_avx(auVar112,auVar87);
                auVar88._8_4_ = 0xc2b0c0a5;
                auVar88._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar88._12_4_ = 0xc2b0c0a5;
                auVar162 = vmaxps_avx(auVar112,auVar88);
                auVar112 = vfmadd213ps_fma(auVar199,auVar162,auVar147);
                auVar168._0_4_ = (int)auVar112._0_4_;
                auVar168._4_4_ = (int)auVar112._4_4_;
                auVar168._8_4_ = (int)auVar112._8_4_;
                auVar168._12_4_ = (int)auVar112._12_4_;
                auVar167 = vcvtdq2ps_avx(auVar168);
                auVar112 = vcmpps_avx(auVar112,auVar167,1);
                auVar112 = vandps_avx(auVar112,auVar57);
                auVar112 = vsubps_avx(auVar167,auVar112);
                auVar167 = vfmsub231ps_fma(auVar162,auVar112,auVar186);
                auVar162 = vfnmsub231ps_fma(auVar167,auVar112,auVar152);
                auVar169._0_4_ = auVar162._0_4_ * auVar162._0_4_;
                auVar169._4_4_ = auVar162._4_4_ * auVar162._4_4_;
                auVar169._8_4_ = auVar162._8_4_ * auVar162._8_4_;
                auVar169._12_4_ = auVar162._12_4_ * auVar162._12_4_;
                auVar193._8_4_ = 0x39506967;
                auVar193._0_8_ = 0x3950696739506967;
                auVar193._12_4_ = 0x39506967;
                auVar89._8_4_ = 0x3ab743ce;
                auVar89._0_8_ = 0x3ab743ce3ab743ce;
                auVar89._12_4_ = 0x3ab743ce;
                auVar167 = vfmadd213ps_fma(auVar193,auVar162,auVar89);
                auVar90._8_4_ = 0x3c088908;
                auVar90._0_8_ = 0x3c0889083c088908;
                auVar90._12_4_ = 0x3c088908;
                auVar167 = vfmadd213ps_fma(auVar167,auVar162,auVar90);
                auVar167 = vfmadd213ps_fma(auVar167,auVar162,auVar156);
                auVar91._8_4_ = 0x3e2aaaaa;
                auVar91._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar91._12_4_ = 0x3e2aaaaa;
                auVar167 = vfmadd213ps_fma(auVar167,auVar162,auVar91);
                auVar167 = vfmadd213ps_fma(auVar167,auVar162,auVar147);
                auVar167 = vfmadd213ps_fma(auVar167,auVar169,auVar162);
                auVar170._0_4_ = auVar167._0_4_ + 1.0;
                auVar170._4_4_ = auVar167._4_4_ + 1.0;
                auVar170._8_4_ = auVar167._8_4_ + 1.0;
                auVar170._12_4_ = auVar167._12_4_ + 1.0;
                auVar101._0_4_ = (int)auVar112._0_4_;
                auVar101._4_4_ = (int)auVar112._4_4_;
                auVar101._8_4_ = (int)auVar112._8_4_;
                auVar101._12_4_ = (int)auVar112._12_4_;
                auVar112 = vpslld_avx(auVar101,0x17);
                auVar112 = vpaddd_avx(auVar112,auVar57);
                auVar167 = vfmadd213ps_fma(auVar112,auVar170,auVar57);
                auVar112 = vrcpps_avx(auVar167);
                auVar171._0_4_ = auVar112._0_4_ + auVar112._0_4_;
                auVar171._4_4_ = auVar112._4_4_ + auVar112._4_4_;
                auVar171._8_4_ = auVar112._8_4_ + auVar112._8_4_;
                auVar171._12_4_ = auVar112._12_4_ + auVar112._12_4_;
                auVar58._8_4_ = 0x40000000;
                auVar58._0_8_ = 0x4000000040000000;
                auVar58._12_4_ = 0x40000000;
                auVar167 = vfmsub213ps_fma(auVar167,auVar171,auVar58);
                auVar112 = vfnmadd213ps_fma(auVar167,auVar112,auVar171);
                auVar117 = vfmsub213ps_fma(auVar65,auVar122,auVar122);
                auVar107 = vfmsub213ps_fma(auVar112,auVar129,auVar129);
                break;
              case 6:
                uVar54 = **(undefined4 **)(&this->field_0x118 + (long)p_Var13);
                auVar106._4_4_ = uVar54;
                auVar106._0_4_ = uVar54;
                auVar106._8_4_ = uVar54;
                auVar106._12_4_ = uVar54;
                uVar54 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var13))[1];
                auVar146._4_4_ = uVar54;
                auVar146._0_4_ = uVar54;
                auVar146._8_4_ = uVar54;
                auVar146._12_4_ = uVar54;
                auVar112 = vfmadd213ps_fma(auVar122,auVar106,auVar146);
                auVar112 = vmaxps_avx(auVar112,(undefined1  [16])0x0);
                auVar60._8_4_ = 0x3f800000;
                auVar60._0_8_ = 0x3f8000003f800000;
                auVar60._12_4_ = 0x3f800000;
                auVar112 = vminps_avx(auVar112,auVar60);
                auVar117._0_4_ = auVar112._0_4_ * auVar122._0_4_;
                auVar117._4_4_ = auVar112._4_4_ * auVar122._4_4_;
                auVar117._8_4_ = auVar112._8_4_ * auVar122._8_4_;
                auVar117._12_4_ = auVar112._12_4_ * auVar122._12_4_;
                auVar112 = vfmadd213ps_fma(auVar106,auVar129,auVar146);
                auVar112 = vmaxps_avx(auVar112,(undefined1  [16])0x0);
                auVar112 = vminps_avx(auVar112,auVar60);
                auVar107._0_4_ = auVar112._0_4_ * auVar129._0_4_;
                auVar107._4_4_ = auVar112._4_4_ * auVar129._4_4_;
                auVar107._8_4_ = auVar112._8_4_ * auVar129._8_4_;
                auVar107._12_4_ = auVar112._12_4_ * auVar129._12_4_;
              }
            }
            if (iVar2 < 0x65) {
              *pauVar33 = auVar117;
              pauVar33[1] = auVar107;
              pauVar33 = pauVar33 + 2;
            }
            else {
              pfVar35 = (float *)(*(long *)(&this->field_0x288 + (long)p_Var13) + uVar27 * 0x20);
              auVar118._0_4_ = auVar117._0_4_ * *pfVar35;
              auVar118._4_4_ = auVar117._4_4_ * pfVar35[1];
              auVar118._8_4_ = auVar117._8_4_ * pfVar35[2];
              auVar118._12_4_ = auVar117._12_4_ * pfVar35[3];
              pfVar35 = (float *)(*(long *)(&this->field_0x288 + (long)p_Var13) + 0x10 +
                                 uVar27 * 0x20);
              auVar108._0_4_ = auVar107._0_4_ * *pfVar35;
              auVar108._4_4_ = auVar107._4_4_ * pfVar35[1];
              auVar108._8_4_ = auVar107._8_4_ * pfVar35[2];
              auVar108._12_4_ = auVar107._12_4_ * pfVar35[3];
              auVar61._8_4_ = 0x80000000;
              auVar61._0_8_ = 0x8000000080000000;
              auVar61._12_4_ = 0x80000000;
              auVar112 = vandps_avx(auVar118,auVar61);
              auVar167 = vandps_avx(auVar108,auVar61);
              auVar62._8_4_ = 0x3f000000;
              auVar62._0_8_ = 0x3f0000003f000000;
              auVar62._12_4_ = 0x3f000000;
              auVar112 = vorps_avx(auVar112,auVar62);
              auVar167 = vorps_avx(auVar167,auVar62);
              auVar119._0_4_ = (int)(auVar118._0_4_ + auVar112._0_4_);
              auVar119._4_4_ = (int)(auVar118._4_4_ + auVar112._4_4_);
              auVar119._8_4_ = (int)(auVar118._8_4_ + auVar112._8_4_);
              auVar119._12_4_ = (int)(auVar118._12_4_ + auVar112._12_4_);
              auVar109._0_4_ = (int)(auVar108._0_4_ + auVar167._0_4_);
              auVar109._4_4_ = (int)(auVar108._4_4_ + auVar167._4_4_);
              auVar109._8_4_ = (int)(auVar108._8_4_ + auVar167._8_4_);
              auVar109._12_4_ = (int)(auVar108._12_4_ + auVar167._12_4_);
              auVar112 = vpackssdw_avx(auVar119,auVar109);
              auVar112 = vpminsw_avx(auVar112,_DAT_004f5590);
              auVar112 = vpmaxsw_avx(auVar112,_DAT_004f55a0);
              auVar112 = vpacksswb_avx(auVar112,auVar112);
              *(long *)*pauVar32 = auVar112._0_8_;
              pauVar32 = (undefined1 (*) [16])((long)*pauVar32 + 8);
            }
          }
        }
        uVar29 = (ulong)(uint)((int)uVar29 + (int)uVar47 * 8);
      }
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&opt_q);
    iVar39 = 0;
    goto LAB_0039ea1e;
  }
  uVar20 = *(uint *)(&this->field_0xd0 + (long)p_Var13);
  iVar42 = *(int *)(&this->field_0x10c + (long)p_Var13);
  if (opt->use_packing_layout == true) {
    if (iVar42 < 0x65) {
      uVar47 = (ulong)((uint)((uVar20 & 3) == 0) * 3 + 1);
    }
    else {
      uVar47 = 1;
      if ((uVar20 & 7) == 0) {
        uVar47 = 8;
      }
    }
  }
  else {
    uVar47 = 1;
  }
  _elempack = (uint)uVar47;
  uVar16 = (ulong)(_elempack * 4);
  if (100 < iVar42) {
    uVar16 = uVar47;
  }
  Mat::create(top_blob,iVar24,iVar37,(int)uVar20 / (int)_elempack,uVar16,_elempack,
              opt->blob_allocator);
  auVar10 = (undefined1  [32])opt_q._32_32_;
  sVar8 = local_2d8.cstep;
  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
  goto LAB_0039ea1e;
  uVar29 = (long)(int)uVar19 /
           (long)*(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3]);
  uVar45 = (long)*(int *)(&this->field_0xd0 + (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3]) /
           (long)*(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3]);
  if (opt->use_packing_layout == true) {
    uVar19 = 1;
    if ((uVar29 & 7) == 0) {
      uVar19 = uVar43;
    }
    if (iVar42 < 0x65) {
      uVar20 = (uint)((uVar45 & 3) == 0) * 3 + 1;
    }
    else {
      uVar20 = 1;
      if ((uVar45 & 7) == 0) {
        uVar20 = uVar43;
      }
    }
  }
  else {
    uVar19 = 1;
    uVar20 = uVar19;
  }
  piVar3 = (int *)CONCAT44(local_2d8.refcount._4_4_,local_2d8.refcount._0_4_);
  opt_q.blob_allocator = (Allocator *)CONCAT44(local_2d8.refcount._4_4_,local_2d8.refcount._0_4_);
  opt_q._0_8_ = local_2d8.data;
  opt_q.workspace_allocator = (Allocator *)local_2d8.elemsize;
  opt_q.openmp_blocktime = local_2d8.elempack;
  opt_q.use_subgroup_shuffle = (bool)(undefined1)local_2d8.w;
  opt_q.use_image_storage = (bool)local_2d8.w._1_1_;
  opt_q.use_tensor_storage = (bool)local_2d8.w._2_1_;
  opt_q.use_reserved_0 = (bool)local_2d8.w._3_1_;
  opt_q.use_shader_pack8 = (bool)(undefined1)local_2d8.dims;
  opt_q.use_subgroup_basic = (bool)local_2d8.dims._1_1_;
  opt_q.use_subgroup_vote = (bool)local_2d8.dims._2_1_;
  opt_q.use_subgroup_ballot = (bool)local_2d8.dims._3_1_;
  opt_q.use_local_pool_allocator = (bool)(undefined1)local_2d8.d;
  opt_q.use_shader_local_memory = (bool)local_2d8.d._1_1_;
  opt_q.use_cooperative_matrix = (bool)local_2d8.d._2_1_;
  opt_q.use_winograd23_convolution = (bool)local_2d8.d._3_1_;
  opt_q.flush_denormals = local_2d8.h;
  opt_q._32_8_ = local_2d8.allocator;
  opt_q._60_4_ = auVar10._28_4_;
  opt_q.use_winograd43_convolution = (bool)(undefined1)local_2d8.c;
  opt_q.use_winograd63_convolution = (bool)local_2d8.c._1_1_;
  opt_q.use_a53_a55_optimized_kernel = (bool)local_2d8.c._2_1_;
  opt_q.use_reserved_7 = (bool)local_2d8.c._3_1_;
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + 1;
    UNLOCK();
  }
  local_338 = uVar29 & 0xffffffff;
  uVar40 = local_338;
  uVar27 = uVar29;
  if ((int)uVar19 < iVar25) {
    _top_rescale = *(void **)opt;
    pAStack_258 = opt->workspace_allocator;
    iStack_250 = opt->openmp_blocktime;
    unique0x1000331a = opt->use_winograd_convolution;
    unique0x1000331b = opt->use_sgemm_convolution;
    unique0x1000331c = opt->use_int8_inference;
    unique0x1000331d = opt->use_vulkan_compute;
    local_248 = *(Allocator **)&opt->use_bf16_storage;
    _iStack_240 = *(undefined8 *)&opt->use_shader_pack8;
    _iStack_238 = *(undefined8 *)&opt->flush_denormals;
    _iStack_230 = *(undefined8 *)&opt->use_winograd43_convolution;
    pAStack_260 = opt->workspace_allocator;
    convert_packing(&local_2d8,(Mat *)&opt_q,uVar19,(Option *)&top_rescale);
    uVar27 = uVar29 & 0xffffffff;
  }
  piVar3 = top_blob->refcount;
  _top_rescale = top_blob->data;
  pAStack_260 = (Allocator *)top_blob->refcount;
  pAStack_258 = (Allocator *)top_blob->elemsize;
  iStack_250 = top_blob->elempack;
  local_248 = top_blob->allocator;
  iStack_240 = top_blob->dims;
  iStack_23c = top_blob->w;
  iStack_238 = top_blob->h;
  iStack_234 = top_blob->d;
  iStack_230 = top_blob->c;
  local_228 = top_blob->cstep;
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + 1;
    UNLOCK();
  }
  if (uVar20 < _elempack) {
    local_300 = (byte)uVar16;
    local_310 = (byte)uVar47;
    Mat::create((Mat *)&top_rescale,iVar24,iVar37,
                *(int *)(&this->field_0xd0 + (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3]) /
                (int)uVar20,(ulong)((local_300 / local_310) * uVar20),uVar20,
                opt->workspace_allocator);
    uVar27 = uVar29 & 0xffffffff;
    iVar39 = -100;
    if ((_top_rescale != (void *)0x0) && ((long)iStack_230 * local_228 != 0)) goto LAB_0039d5ec;
  }
  else {
LAB_0039d5ec:
    iVar24 = 0;
    iVar42 = 0;
    for (lVar31 = 0; auVar10 = (undefined1  [32])opt_q._32_32_,
        lVar31 < *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3]);
        lVar31 = lVar31 + 1) {
      local_178 = (int)uVar27 / (int)uVar19;
      _scale_out = (void *)((long)(iVar24 / (int)uVar19) * sVar8 * (long)opt_q.workspace_allocator +
                           opt_q._0_8_);
      local_1a8 = (int *)0x0;
      local_1a0 = opt_q.workspace_allocator;
      local_198 = opt_q.openmp_blocktime;
      local_190 = (long *)opt_q._32_8_;
      uVar9 = opt_q._40_8_;
      uVar11 = opt_q._48_8_;
      local_170 = ((long)(int)opt_q._52_4_ * (long)opt_q.workspace_allocator *
                   (long)opt_q.flush_denormals * (long)(int)opt_q._44_4_ + 0xfU & 0xfffffffffffffff0
                  ) / (ulong)opt_q.workspace_allocator;
      opt_q.use_shader_pack8 = SUB81(uVar9,0);
      opt_q.use_subgroup_basic = SUB81(uVar9,1);
      opt_q.use_subgroup_vote = SUB81(uVar9,2);
      opt_q.use_subgroup_ballot = SUB81(uVar9,3);
      opt_q.use_subgroup_shuffle = SUB81(uVar9,4);
      opt_q.use_image_storage = SUB81(uVar9,5);
      opt_q.use_tensor_storage = SUB81(uVar9,6);
      opt_q.use_reserved_0 = SUB81(uVar9,7);
      local_188 = opt_q.use_shader_pack8;
      bStack_187 = opt_q.use_subgroup_basic;
      bStack_186 = opt_q.use_subgroup_vote;
      bStack_185 = opt_q.use_subgroup_ballot;
      bStack_184 = opt_q.use_subgroup_shuffle;
      bStack_183 = opt_q.use_image_storage;
      bStack_182 = opt_q.use_tensor_storage;
      bStack_181 = opt_q.use_reserved_0;
      opt_q.flush_denormals = (int)uVar11;
      opt_q.use_local_pool_allocator = SUB81(uVar11,4);
      opt_q.use_shader_local_memory = SUB81(uVar11,5);
      opt_q.use_cooperative_matrix = SUB81(uVar11,6);
      opt_q.use_winograd23_convolution = SUB81(uVar11,7);
      iStack_180 = opt_q.flush_denormals;
      bStack_17c = opt_q.use_local_pool_allocator;
      bStack_17b = opt_q.use_shader_local_memory;
      bStack_17a = opt_q.use_cooperative_matrix;
      bStack_179 = opt_q.use_winograd23_convolution;
      m_1.data = (void *)((long)(iVar42 / (int)uVar20) * local_228 * (long)pAStack_258 +
                         (long)_top_rescale);
      m_1.refcount = (int *)0x0;
      m_1.elemsize = (size_t)pAStack_258;
      m_1.elempack = iStack_250;
      m_1.allocator = local_248;
      m_1.c = (int)((long)((ulong)(uint)((int)uVar45 >> 0x1f) << 0x20 | uVar45 & 0xffffffff) /
                   (long)(int)uVar20);
      m_1.cstep = ((long)iStack_234 * (long)pAStack_258 * (long)iStack_238 * (long)iStack_23c + 0xfU
                  & 0xfffffffffffffff0) / (ulong)pAStack_258;
      m_1.dims = iStack_240;
      m_1.w = iStack_23c;
      m_1.h = iStack_238;
      m_1.d = iStack_234;
      pLVar5 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar31];
      opt_g.lightmode = opt->lightmode;
      opt_g._1_3_ = *(undefined3 *)&opt->field_0x1;
      opt_g.num_threads = opt->num_threads;
      opt_g.workspace_allocator = opt->workspace_allocator;
      opt_g.openmp_blocktime = opt->openmp_blocktime;
      opt_g.use_winograd_convolution = opt->use_winograd_convolution;
      opt_g.use_sgemm_convolution = opt->use_sgemm_convolution;
      opt_g.use_int8_inference = opt->use_int8_inference;
      opt_g.use_vulkan_compute = opt->use_vulkan_compute;
      opt_g.use_bf16_storage = opt->use_bf16_storage;
      opt_g.use_fp16_packed = opt->use_fp16_packed;
      opt_g.use_fp16_storage = opt->use_fp16_storage;
      opt_g.use_fp16_arithmetic = opt->use_fp16_arithmetic;
      opt_g.use_int8_packed = opt->use_int8_packed;
      opt_g.use_int8_storage = opt->use_int8_storage;
      opt_g.use_int8_arithmetic = opt->use_int8_arithmetic;
      opt_g.use_packing_layout = opt->use_packing_layout;
      opt_g.use_shader_pack8 = opt->use_shader_pack8;
      opt_g.use_subgroup_basic = opt->use_subgroup_basic;
      opt_g.use_subgroup_vote = opt->use_subgroup_vote;
      opt_g.use_subgroup_ballot = opt->use_subgroup_ballot;
      opt_g.use_subgroup_shuffle = opt->use_subgroup_shuffle;
      opt_g.use_image_storage = opt->use_image_storage;
      opt_g.use_tensor_storage = opt->use_tensor_storage;
      opt_g.use_reserved_0 = opt->use_reserved_0;
      opt_g.flush_denormals = opt->flush_denormals;
      opt_g.use_local_pool_allocator = opt->use_local_pool_allocator;
      opt_g.use_shader_local_memory = opt->use_shader_local_memory;
      opt_g.use_cooperative_matrix = opt->use_cooperative_matrix;
      opt_g.use_winograd23_convolution = opt->use_winograd23_convolution;
      opt_g.use_winograd43_convolution = opt->use_winograd43_convolution;
      opt_g.use_winograd63_convolution = opt->use_winograd63_convolution;
      opt_g.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
      opt_g.use_reserved_7 = opt->use_reserved_7;
      opt_g.use_reserved_8 = opt->use_reserved_8;
      opt_g.use_reserved_9 = opt->use_reserved_9;
      opt_g.use_reserved_10 = opt->use_reserved_10;
      opt_g.use_reserved_11 = opt->use_reserved_11;
      opt_g.blob_allocator = local_248;
      opt_q._32_32_ = auVar10;
      (*pLVar5->_vptr_Layer[7])(pLVar5,&scale_out,&m_1,&opt_g);
      local_338._0_4_ = (int)uVar29;
      if (m_1.refcount != (int *)0x0) {
        LOCK();
        *m_1.refcount = *m_1.refcount + -1;
        UNLOCK();
        if (*m_1.refcount == 0) {
          if (m_1.allocator == (Allocator *)0x0) {
            free(m_1.data);
          }
          else {
            (*(m_1.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if (local_1a8 != (int *)0x0) {
        LOCK();
        *local_1a8 = *local_1a8 + -1;
        UNLOCK();
        if (*local_1a8 == 0) {
          if (local_190 == (long *)0x0) {
            free(_scale_out);
          }
          else {
            (**(code **)(*local_190 + 0x18))();
          }
        }
      }
      iVar42 = iVar42 + (int)uVar45;
      iVar24 = iVar24 + (int)local_338;
      uVar27 = uVar40;
    }
    if (uVar20 < _elempack) {
      iVar39 = 0;
      convert_packing((Mat *)&top_rescale,top_blob,_elempack,opt);
    }
    else {
      iVar39 = 0;
      if ((Mat *)&top_rescale != top_blob) {
        if (pAStack_260 != (Allocator *)0x0) {
          LOCK();
          *(int *)&pAStack_260->_vptr_Allocator = *(int *)&pAStack_260->_vptr_Allocator + 1;
          UNLOCK();
        }
        piVar3 = top_blob->refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              free(top_blob->data);
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data = _top_rescale;
        top_blob->refcount = (int *)pAStack_260;
        top_blob->elemsize = (size_t)pAStack_258;
        top_blob->elempack = iStack_250;
        top_blob->allocator = local_248;
        top_blob->dims = iStack_240;
        top_blob->w = iStack_23c;
        top_blob->h = iStack_238;
        top_blob->d = iStack_234;
        top_blob->c = iStack_230;
        top_blob->cstep = local_228;
      }
    }
  }
  if (pAStack_260 != (Allocator *)0x0) {
    LOCK();
    *(int *)&pAStack_260->_vptr_Allocator = *(int *)&pAStack_260->_vptr_Allocator + -1;
    UNLOCK();
    if (*(int *)&pAStack_260->_vptr_Allocator == 0) {
      if (local_248 == (Allocator *)0x0) {
        free(_top_rescale);
      }
      else {
        (*local_248->_vptr_Allocator[3])();
      }
    }
  }
  if (opt_q.blob_allocator != (Allocator *)0x0) {
    LOCK();
    *(int *)&(opt_q.blob_allocator)->_vptr_Allocator =
         *(int *)&(opt_q.blob_allocator)->_vptr_Allocator + -1;
    UNLOCK();
    if (*(int *)&(opt_q.blob_allocator)->_vptr_Allocator == 0) {
      if (opt_q._32_8_ == 0) {
        free((void *)opt_q._0_8_);
      }
      else {
        (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
      }
    }
  }
LAB_0039ea1e:
  piVar3 = (int *)CONCAT44(local_2d8.refcount._4_4_,local_2d8.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_2d8.allocator == (Allocator *)0x0) {
        free(local_2d8.data);
      }
      else {
        (*(local_2d8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if (local_168.refcount != (int *)0x0) {
    LOCK();
    *local_168.refcount = *local_168.refcount + -1;
    UNLOCK();
    if (*local_168.refcount == 0) {
      if (local_168.allocator == (Allocator *)0x0) {
        free(local_168.data);
      }
      else {
        (*(local_168.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar39;
}

Assistant:

int ConvolutionDepthWise_x86_fma::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int elempack = bottom_blob.elempack;

    int elembits = bottom_blob.elembits();

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_int8 = bottom_blob;
    if (elembits != 8)
    {
        const int channels_g = channels * elempack / group;

        Mat scales(channels * elempack);
        {
            float* ps = scales;
            for (int g = 0; g < group; g++)
            {
                float scale = bottom_blob_int8_scales[g];
                for (int q = 0; q < channels_g; q++)
                {
                    *ps++ = scale;
                }
            }
        }

        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, scales, opt_q);
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;
    channels = bottom_blob_bordered.c;
    elempack = bottom_blob_bordered.elempack;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        }
#endif // __SSE2__
        bool use_int8_requantize = int8_scale_term > 100;
        size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

        top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

#if __SSE2__
        if (elempack == 8)
        {
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    signed char* outptr_s8 = top_blob.channel(g);
                    float* outptr_f32 = top_blob.channel(g);
                    const signed char* kptr = (const signed char*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128i _sum0 = _mm_setzero_si128();
                            __m128i _sum1 = _mm_setzero_si128();

                            const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w * 8;

                            for (int k = 0; k < maxk; k++)
                            {
                                // TODO use _mm_cvtepi8_epi16 on sse4.1
                                __m128i _val = _mm_loadl_epi64((const __m128i*)(sptr + space_ofs[k] * 8));
                                _val = _mm_unpacklo_epi8(_val, _mm_cmpgt_epi8(_mm_setzero_si128(), _val));

                                __m128i _w = _mm_loadl_epi64((const __m128i*)(kptr + k * 8));
                                _w = _mm_unpacklo_epi8(_w, _mm_cmpgt_epi8(_mm_setzero_si128(), _w));

                                __m128i _sl = _mm_mullo_epi16(_val, _w);
                                __m128i _sh = _mm_mulhi_epi16(_val, _w);
                                __m128i _s0 = _mm_unpacklo_epi16(_sl, _sh);
                                __m128i _s1 = _mm_unpackhi_epi16(_sl, _sh);

                                _sum0 = _mm_add_epi32(_sum0, _s0);
                                _sum1 = _mm_add_epi32(_sum1, _s1);
                            }

                            __m128 _scale_in0;
                            __m128 _scale_in1;
                            {
                                __m128 _bottom_blob_int8_scales0 = _mm_loadu_ps((const float*)bottom_blob_int8_scales + g * 8);
                                __m128 _bottom_blob_int8_scales1 = _mm_loadu_ps((const float*)bottom_blob_int8_scales + g * 8 + 4);
                                __m128 _weight_data_int8_scales0 = _mm_loadu_ps((const float*)weight_data_int8_scales + g * 8);
                                __m128 _weight_data_int8_scales1 = _mm_loadu_ps((const float*)weight_data_int8_scales + g * 8 + 4);
                                _scale_in0 = _mm_rcp_ps(_mm_mul_ps(_bottom_blob_int8_scales0, _weight_data_int8_scales0));
                                _scale_in1 = _mm_rcp_ps(_mm_mul_ps(_bottom_blob_int8_scales1, _weight_data_int8_scales1));

                                __m128 _m0 = _mm_cmpneq_ps(_weight_data_int8_scales0, _mm_setzero_ps());
                                __m128 _m1 = _mm_cmpneq_ps(_weight_data_int8_scales1, _mm_setzero_ps());
                                _scale_in0 = _mm_and_ps(_scale_in0, _m0);
                                _scale_in1 = _mm_and_ps(_scale_in1, _m1);
                            }

                            __m128 _sumfp32_0 = _mm_mul_ps(_mm_cvtepi32_ps(_sum0), _scale_in0);
                            __m128 _sumfp32_1 = _mm_mul_ps(_mm_cvtepi32_ps(_sum1), _scale_in1);

                            if (bias_term)
                            {
                                __m128 _bias0 = _mm_loadu_ps((const float*)bias_data + g * 8);
                                __m128 _bias1 = _mm_loadu_ps((const float*)bias_data + g * 8 + 4);
                                _sumfp32_0 = _mm_add_ps(_sumfp32_0, _bias0);
                                _sumfp32_1 = _mm_add_ps(_sumfp32_1, _bias1);
                            }

                            _sumfp32_0 = activation_sse(_sumfp32_0, activation_type, activation_params);
                            _sumfp32_1 = activation_sse(_sumfp32_1, activation_type, activation_params);

                            if (use_int8_requantize)
                            {
                                // requantize and relu
                                __m128 _scale_out0 = _mm_loadu_ps((const float*)top_blob_int8_scales + g * 8);
                                __m128 _scale_out1 = _mm_loadu_ps((const float*)top_blob_int8_scales + g * 8 + 4);
                                _sumfp32_0 = _mm_mul_ps(_sumfp32_0, _scale_out0);
                                _sumfp32_1 = _mm_mul_ps(_sumfp32_1, _scale_out1);
                                int64_t _sum8 = float2int8_sse(_sumfp32_0, _sumfp32_1);

                                *(int64_t*)outptr_s8 = _sum8;
                                outptr_s8 += 8;
                            }
                            else
                            {
                                // dequantize and relu
                                _mm_storeu_ps(outptr_f32, _sumfp32_0);
                                _mm_storeu_ps(outptr_f32 + 4, _sumfp32_1);
                                outptr_f32 += 8;
                            }
                        }
                    }
                }
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            if (kernel_w == 3 && kernel_h == 3 && stride_w == 1 && stride_h == 1 && dilation_w == 1 && dilation_h == 1 && (activation_type == 0 || activation_type == 1))
            {
                if (use_int8_requantize)
                {
                    std::vector<float> requantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float scale_out = top_blob_int8_scales[g];

                        requantize_scales.push_back(scale_in);
                        requantize_scales.push_back(scale_out);
                    }

                    convdw3x3s1_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, requantize_scales, opt);
                }
                else
                {
                    std::vector<float> dequantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        dequantize_scales.push_back(top_rescale);
                    }

                    convdw3x3s1_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, dequantize_scales, opt);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
            else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2 && (activation_type == 0 || activation_type == 1))
            {
                if (use_int8_requantize)
                {
                    std::vector<float> requantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float scale_out = top_blob_int8_scales[g];

                        requantize_scales.push_back(scale_in);
                        requantize_scales.push_back(scale_out);
                    }

                    convdw3x3s2_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, requantize_scales, opt);
                }
                else
                {
                    std::vector<float> dequantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        dequantize_scales.push_back(top_rescale);
                    }

                    convdw3x3s2_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, dequantize_scales, opt);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < group; g++)
                {
                    signed char* outptr_s8 = top_blob.channel(g);
                    float* outptr_f32 = top_blob.channel(g);
                    const signed char* kptr = (const signed char*)weight_data_tm + maxk * g;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            int sum = 0;

                            const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w;

                            for (int k = 0; k < maxk; k++)
                            {
                                signed char val = sptr[space_ofs[k]];
                                signed char w = kptr[k];
                                sum += val * w;
                            }

                            float scale_in;
                            if (weight_data_int8_scales[g] == 0)
                                scale_in = 0;
                            else
                                scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                            float sumfp32 = sum * scale_in;

                            if (bias_term)
                                sumfp32 += bias_data[g];

                            sumfp32 = activation_ss(sumfp32, activation_type, activation_params);

                            if (use_int8_requantize)
                            {
                                // requantize
                                float scale_out = top_blob_int8_scales[g];
                                signed char sums8 = float2int8(sumfp32 * scale_out);
                                outptr_s8[0] = sums8;
                                outptr_s8 += 1;
                            }
                            else
                            {
                                // dequantize
                                outptr_f32[0] = sumfp32;
                                outptr_f32 += 1;
                            }
                        }
                    }
                }
            }
        }

        return 0;
    }

    bool use_int8_requantize = int8_scale_term > 100;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        if (use_int8_requantize)
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        else
            out_elempack = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__
    size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // group convolution
    const int channels_g = channels * elempack / group;
    const int num_output_g = num_output / group;

    int g_elempack = 1;
    int out_g_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        g_elempack = channels_g % 8 == 0 ? 8 : 1;
        if (use_int8_requantize)
            out_g_elempack = num_output_g % 8 == 0 ? 8 : 1;
        else
            out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__

    // unpacking
    Mat bottom_blob_bordered_unpacked = bottom_blob_bordered;
    if (elempack > g_elempack)
    {
        Option opt_p = opt;
        opt_p.blob_allocator = opt.workspace_allocator;
        convert_packing(bottom_blob_bordered, bottom_blob_bordered_unpacked, g_elempack, opt_p);
    }

    Mat top_blob_unpacked = top_blob;
    if (out_g_elempack < out_elempack)
    {
        top_blob_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
        if (top_blob_unpacked.empty())
            return -100;
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
        Mat top_blob_g = top_blob_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob_unpacked.allocator;

        // forward
        op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
    }

    // packing
    if (out_g_elempack < out_elempack)
    {
        convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
    }
    else
    {
        top_blob = top_blob_unpacked;
    }

    return 0;
}